

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<4,4>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive PVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [12];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  byte bVar49;
  byte bVar50;
  byte bVar51;
  byte bVar52;
  long lVar53;
  uint uVar54;
  ulong uVar55;
  bool bVar56;
  uint uVar57;
  bool bVar58;
  ulong uVar59;
  ulong uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar122;
  uint uVar123;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  uint uVar125;
  uint uVar126;
  uint uVar127;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  uint uVar124;
  uint uVar128;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar121 [32];
  float fVar129;
  float fVar147;
  vint4 bi_2;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar148;
  vint4 bi_1;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar151 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  vint4 bi;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar190;
  float fVar205;
  float fVar206;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar207;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar216;
  float fVar217;
  vint4 ai_2;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar218;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar219;
  vint4 ai;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  vint4 ai_1;
  float fVar244;
  undefined1 auVar238 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [64];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [64];
  float fVar237;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  float fVar242;
  float fVar243;
  undefined1 auVar241 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  float s;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_a1c;
  undefined1 local_9a0 [16];
  undefined4 local_990;
  uint local_98c;
  float local_988;
  float local_984;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [16];
  RTCFilterFunctionNArguments local_790;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  float local_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [16];
  Primitive *local_5f0;
  ulong local_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  RTCHitN local_520 [16];
  undefined1 auStack_510 [16];
  undefined4 local_500;
  undefined4 uStack_4fc;
  undefined4 uStack_4f8;
  undefined4 uStack_4f4;
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [16];
  uint local_4b0;
  uint uStack_4ac;
  uint uStack_4a8;
  uint uStack_4a4;
  uint uStack_4a0;
  uint uStack_49c;
  uint uStack_498;
  uint uStack_494;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar116 [32];
  undefined1 auVar120 [32];
  
  PVar1 = prim[1];
  uVar55 = (ulong)(byte)PVar1;
  fVar129 = *(float *)(prim + uVar55 * 0x19 + 0x12);
  auVar67 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar67 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar65 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar65 = vinsertps_avx(auVar65,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar67 = vsubps_avx(auVar67,*(undefined1 (*) [16])(prim + uVar55 * 0x19 + 6));
  auVar191._0_4_ = fVar129 * auVar67._0_4_;
  auVar191._4_4_ = fVar129 * auVar67._4_4_;
  auVar191._8_4_ = fVar129 * auVar67._8_4_;
  auVar191._12_4_ = fVar129 * auVar67._12_4_;
  auVar130._0_4_ = fVar129 * auVar65._0_4_;
  auVar130._4_4_ = fVar129 * auVar65._4_4_;
  auVar130._8_4_ = fVar129 * auVar65._8_4_;
  auVar130._12_4_ = fVar129 * auVar65._12_4_;
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 4 + 6)));
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 5 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 6 + 6)));
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 0xb + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6)));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar1 * 0xc + uVar55 + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  uVar59 = (ulong)(uint)((int)(uVar55 * 9) * 2);
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 + 6)));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar238 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 + uVar55 + 6)));
  auVar238 = vcvtdq2ps_avx(auVar238);
  uVar60 = (ulong)(uint)((int)(uVar55 * 5) << 2);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar252._4_4_ = auVar130._0_4_;
  auVar252._0_4_ = auVar130._0_4_;
  auVar252._8_4_ = auVar130._0_4_;
  auVar252._12_4_ = auVar130._0_4_;
  auVar73 = vshufps_avx(auVar130,auVar130,0x55);
  auVar66 = vshufps_avx(auVar130,auVar130,0xaa);
  fVar129 = auVar66._0_4_;
  auVar166._0_4_ = fVar129 * auVar68._0_4_;
  fVar147 = auVar66._4_4_;
  auVar166._4_4_ = fVar147 * auVar68._4_4_;
  fVar190 = auVar66._8_4_;
  auVar166._8_4_ = fVar190 * auVar68._8_4_;
  fVar205 = auVar66._12_4_;
  auVar166._12_4_ = fVar205 * auVar68._12_4_;
  auVar149._0_4_ = auVar69._0_4_ * fVar129;
  auVar149._4_4_ = auVar69._4_4_ * fVar147;
  auVar149._8_4_ = auVar69._8_4_ * fVar190;
  auVar149._12_4_ = auVar69._12_4_ * fVar205;
  auVar131._0_4_ = auVar11._0_4_ * fVar129;
  auVar131._4_4_ = auVar11._4_4_ * fVar147;
  auVar131._8_4_ = auVar11._8_4_ * fVar190;
  auVar131._12_4_ = auVar11._12_4_ * fVar205;
  auVar66 = vfmadd231ps_fma(auVar166,auVar73,auVar65);
  auVar64 = vfmadd231ps_fma(auVar149,auVar73,auVar71);
  auVar73 = vfmadd231ps_fma(auVar131,auVar238,auVar73);
  auVar63 = vfmadd231ps_fma(auVar66,auVar252,auVar67);
  auVar64 = vfmadd231ps_fma(auVar64,auVar252,auVar70);
  auVar130 = vfmadd231ps_fma(auVar73,auVar72,auVar252);
  auVar253._4_4_ = auVar191._0_4_;
  auVar253._0_4_ = auVar191._0_4_;
  auVar253._8_4_ = auVar191._0_4_;
  auVar253._12_4_ = auVar191._0_4_;
  auVar73 = vshufps_avx(auVar191,auVar191,0x55);
  auVar66 = vshufps_avx(auVar191,auVar191,0xaa);
  fVar129 = auVar66._0_4_;
  auVar256._0_4_ = fVar129 * auVar68._0_4_;
  fVar147 = auVar66._4_4_;
  auVar256._4_4_ = fVar147 * auVar68._4_4_;
  fVar190 = auVar66._8_4_;
  auVar256._8_4_ = fVar190 * auVar68._8_4_;
  fVar205 = auVar66._12_4_;
  auVar256._12_4_ = fVar205 * auVar68._12_4_;
  auVar212._0_4_ = auVar69._0_4_ * fVar129;
  auVar212._4_4_ = auVar69._4_4_ * fVar147;
  auVar212._8_4_ = auVar69._8_4_ * fVar190;
  auVar212._12_4_ = auVar69._12_4_ * fVar205;
  auVar192._0_4_ = auVar11._0_4_ * fVar129;
  auVar192._4_4_ = auVar11._4_4_ * fVar147;
  auVar192._8_4_ = auVar11._8_4_ * fVar190;
  auVar192._12_4_ = auVar11._12_4_ * fVar205;
  auVar65 = vfmadd231ps_fma(auVar256,auVar73,auVar65);
  auVar68 = vfmadd231ps_fma(auVar212,auVar73,auVar71);
  auVar71 = vfmadd231ps_fma(auVar192,auVar73,auVar238);
  auVar69 = vfmadd231ps_fma(auVar65,auVar253,auVar67);
  auVar238 = vfmadd231ps_fma(auVar68,auVar253,auVar70);
  auVar232._8_4_ = 0x7fffffff;
  auVar232._0_8_ = 0x7fffffff7fffffff;
  auVar232._12_4_ = 0x7fffffff;
  auVar11 = vfmadd231ps_fma(auVar71,auVar253,auVar72);
  auVar67 = vandps_avx(auVar63,auVar232);
  auVar225._8_4_ = 0x219392ef;
  auVar225._0_8_ = 0x219392ef219392ef;
  auVar225._12_4_ = 0x219392ef;
  uVar59 = vcmpps_avx512vl(auVar67,auVar225,1);
  bVar56 = (bool)((byte)uVar59 & 1);
  auVar66._0_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar63._0_4_;
  bVar56 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar66._4_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar63._4_4_;
  bVar56 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar66._8_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar63._8_4_;
  bVar56 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar66._12_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar63._12_4_;
  auVar67 = vandps_avx(auVar64,auVar232);
  uVar59 = vcmpps_avx512vl(auVar67,auVar225,1);
  bVar56 = (bool)((byte)uVar59 & 1);
  auVar63._0_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar64._0_4_;
  bVar56 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar63._4_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar64._4_4_;
  bVar56 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar63._8_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar64._8_4_;
  bVar56 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar63._12_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar64._12_4_;
  auVar67 = vandps_avx(auVar130,auVar232);
  uVar59 = vcmpps_avx512vl(auVar67,auVar225,1);
  bVar56 = (bool)((byte)uVar59 & 1);
  auVar64._0_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar130._0_4_;
  bVar56 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar64._4_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar130._4_4_;
  bVar56 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar64._8_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar130._8_4_;
  bVar56 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar64._12_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar130._12_4_;
  auVar65 = vrcp14ps_avx512vl(auVar66);
  auVar226._8_4_ = 0x3f800000;
  auVar226._0_8_ = 0x3f8000003f800000;
  auVar226._12_4_ = 0x3f800000;
  auVar67 = vfnmadd213ps_fma(auVar66,auVar65,auVar226);
  auVar70 = vfmadd132ps_fma(auVar67,auVar65,auVar65);
  auVar65 = vrcp14ps_avx512vl(auVar63);
  auVar67 = vfnmadd213ps_fma(auVar63,auVar65,auVar226);
  auVar71 = vfmadd132ps_fma(auVar67,auVar65,auVar65);
  auVar65 = vrcp14ps_avx512vl(auVar64);
  auVar67 = vfnmadd213ps_fma(auVar64,auVar65,auVar226);
  auVar72 = vfmadd132ps_fma(auVar67,auVar65,auVar65);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + uVar55 * 7 + 6);
  auVar67 = vpmovsxwd_avx(auVar67);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar67 = vsubps_avx(auVar67,auVar69);
  auVar220._0_4_ = auVar70._0_4_ * auVar67._0_4_;
  auVar220._4_4_ = auVar70._4_4_ * auVar67._4_4_;
  auVar220._8_4_ = auVar70._8_4_ * auVar67._8_4_;
  auVar220._12_4_ = auVar70._12_4_ * auVar67._12_4_;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *(ulong *)(prim + uVar55 * 9 + 6);
  auVar67 = vpmovsxwd_avx(auVar65);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar67 = vsubps_avx(auVar67,auVar69);
  auVar66 = vpbroadcastd_avx512vl();
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar65 = vpmovsxwd_avx(auVar68);
  auVar167._0_4_ = auVar70._0_4_ * auVar67._0_4_;
  auVar167._4_4_ = auVar70._4_4_ * auVar67._4_4_;
  auVar167._8_4_ = auVar70._8_4_ * auVar67._8_4_;
  auVar167._12_4_ = auVar70._12_4_ * auVar67._12_4_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + uVar55 * -2 + 6);
  auVar67 = vpmovsxwd_avx(auVar70);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar67 = vsubps_avx(auVar67,auVar238);
  auVar227._0_4_ = auVar71._0_4_ * auVar67._0_4_;
  auVar227._4_4_ = auVar71._4_4_ * auVar67._4_4_;
  auVar227._8_4_ = auVar71._8_4_ * auVar67._8_4_;
  auVar227._12_4_ = auVar71._12_4_ * auVar67._12_4_;
  auVar67 = vcvtdq2ps_avx(auVar65);
  auVar67 = vsubps_avx(auVar67,auVar238);
  auVar150._0_4_ = auVar71._0_4_ * auVar67._0_4_;
  auVar150._4_4_ = auVar71._4_4_ * auVar67._4_4_;
  auVar150._8_4_ = auVar71._8_4_ * auVar67._8_4_;
  auVar150._12_4_ = auVar71._12_4_ * auVar67._12_4_;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar60 + uVar55 + 6);
  auVar67 = vpmovsxwd_avx(auVar71);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar67 = vsubps_avx(auVar67,auVar11);
  auVar213._0_4_ = auVar72._0_4_ * auVar67._0_4_;
  auVar213._4_4_ = auVar72._4_4_ * auVar67._4_4_;
  auVar213._8_4_ = auVar72._8_4_ * auVar67._8_4_;
  auVar213._12_4_ = auVar72._12_4_ * auVar67._12_4_;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar55 * 0x17 + 6);
  auVar67 = vpmovsxwd_avx(auVar69);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar67 = vsubps_avx(auVar67,auVar11);
  auVar132._0_4_ = auVar72._0_4_ * auVar67._0_4_;
  auVar132._4_4_ = auVar72._4_4_ * auVar67._4_4_;
  auVar132._8_4_ = auVar72._8_4_ * auVar67._8_4_;
  auVar132._12_4_ = auVar72._12_4_ * auVar67._12_4_;
  auVar67 = vpminsd_avx(auVar220,auVar167);
  auVar65 = vpminsd_avx(auVar227,auVar150);
  auVar67 = vmaxps_avx(auVar67,auVar65);
  auVar65 = vpminsd_avx(auVar213,auVar132);
  uVar148 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar72._4_4_ = uVar148;
  auVar72._0_4_ = uVar148;
  auVar72._8_4_ = uVar148;
  auVar72._12_4_ = uVar148;
  auVar65 = vmaxps_avx512vl(auVar65,auVar72);
  auVar67 = vmaxps_avx(auVar67,auVar65);
  auVar238._8_4_ = 0x3f7ffffa;
  auVar238._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar238._12_4_ = 0x3f7ffffa;
  local_3e0 = vmulps_avx512vl(auVar67,auVar238);
  auVar67 = vpmaxsd_avx(auVar220,auVar167);
  auVar65 = vpmaxsd_avx(auVar227,auVar150);
  auVar67 = vminps_avx(auVar67,auVar65);
  auVar65 = vpmaxsd_avx(auVar213,auVar132);
  uVar148 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar11._4_4_ = uVar148;
  auVar11._0_4_ = uVar148;
  auVar11._8_4_ = uVar148;
  auVar11._12_4_ = uVar148;
  auVar65 = vminps_avx512vl(auVar65,auVar11);
  auVar67 = vminps_avx(auVar67,auVar65);
  auVar73._8_4_ = 0x3f800003;
  auVar73._0_8_ = 0x3f8000033f800003;
  auVar73._12_4_ = 0x3f800003;
  auVar67 = vmulps_avx512vl(auVar67,auVar73);
  uVar12 = vcmpps_avx512vl(local_3e0,auVar67,2);
  local_5e8 = vpcmpgtd_avx512vl(auVar66,_DAT_01f7fcf0);
  local_5e8 = ((byte)uVar12 & 0xf) & local_5e8;
  if ((char)local_5e8 == '\0') {
    return false;
  }
  local_550 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_5f0 = prim;
LAB_01abe839:
  lVar53 = 0;
  for (uVar59 = local_5e8; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
    lVar53 = lVar53 + 1;
  }
  uVar57 = *(uint *)(prim + 2);
  pGVar2 = (context->scene->geometries).items[uVar57].ptr;
  uVar59 = (ulong)*(uint *)(*(long *)&pGVar2->field_0x58 +
                           pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar53 * 4 + 6));
  p_Var3 = pGVar2[1].intersectionFilterN;
  lVar53 = *(long *)&pGVar2[1].time_range.upper;
  auVar67 = *(undefined1 (*) [16])(lVar53 + (long)p_Var3 * uVar59);
  auVar65 = *(undefined1 (*) [16])(lVar53 + (uVar59 + 1) * (long)p_Var3);
  local_5e8 = local_5e8 - 1 & local_5e8;
  if (local_5e8 != 0) {
    uVar55 = local_5e8 - 1 & local_5e8;
    for (uVar60 = local_5e8; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
    }
    if (uVar55 != 0) {
      for (; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar68 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar70 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar148 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar248._4_4_ = uVar148;
  auVar248._0_4_ = uVar148;
  auVar248._8_4_ = uVar148;
  auVar248._12_4_ = uVar148;
  fStack_430 = (float)uVar148;
  _local_440 = auVar248;
  fStack_42c = (float)uVar148;
  fStack_428 = (float)uVar148;
  register0x0000151c = uVar148;
  uVar148 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar254._4_4_ = uVar148;
  auVar254._0_4_ = uVar148;
  auVar254._8_4_ = uVar148;
  auVar254._12_4_ = uVar148;
  local_460._16_4_ = uVar148;
  local_460._0_16_ = auVar254;
  local_460._20_4_ = uVar148;
  local_460._24_4_ = uVar148;
  local_460._28_4_ = uVar148;
  auVar68 = vunpcklps_avx(auVar248,auVar254);
  fVar129 = *(float *)(ray + k * 4 + 0x60);
  auVar255._4_4_ = fVar129;
  auVar255._0_4_ = fVar129;
  auVar255._8_4_ = fVar129;
  auVar255._12_4_ = fVar129;
  local_480._16_4_ = fVar129;
  local_480._0_16_ = auVar255;
  local_480._20_4_ = fVar129;
  local_480._24_4_ = fVar129;
  local_480._28_4_ = fVar129;
  local_6f0 = vinsertps_avx(auVar68,auVar255,0x28);
  auVar221._0_4_ = auVar67._0_4_ + auVar65._0_4_;
  auVar221._4_4_ = auVar67._4_4_ + auVar65._4_4_;
  auVar221._8_4_ = auVar67._8_4_ + auVar65._8_4_;
  auVar221._12_4_ = auVar67._12_4_ + auVar65._12_4_;
  auVar16._8_4_ = 0x3f000000;
  auVar16._0_8_ = 0x3f0000003f000000;
  auVar16._12_4_ = 0x3f000000;
  auVar68 = vmulps_avx512vl(auVar221,auVar16);
  auVar68 = vsubps_avx(auVar68,auVar70);
  auVar68 = vdpps_avx(auVar68,local_6f0,0x7f);
  fVar147 = *(float *)(ray + k * 4 + 0x30);
  auVar245 = ZEXT464((uint)fVar147);
  local_700 = vdpps_avx(local_6f0,local_6f0,0x7f);
  auVar247 = ZEXT1664(local_700);
  auVar228._4_12_ = ZEXT812(0) << 0x20;
  auVar228._0_4_ = local_700._0_4_;
  auVar69 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar228);
  auVar71 = vfnmadd213ss_fma(auVar69,local_700,ZEXT416(0x40000000));
  local_320 = auVar68._0_4_ * auVar69._0_4_ * auVar71._0_4_;
  auVar229._4_4_ = local_320;
  auVar229._0_4_ = local_320;
  auVar229._8_4_ = local_320;
  auVar229._12_4_ = local_320;
  fStack_970 = local_320;
  _local_980 = auVar229;
  fStack_96c = local_320;
  fStack_968 = local_320;
  fStack_964 = local_320;
  auVar68 = vfmadd231ps_fma(auVar70,local_6f0,auVar229);
  auVar68 = vblendps_avx(auVar68,ZEXT816(0) << 0x40,8);
  auVar67 = vsubps_avx(auVar67,auVar68);
  auVar70 = vsubps_avx(*(undefined1 (*) [16])(lVar53 + (uVar59 + 2) * (long)p_Var3),auVar68);
  auVar236 = ZEXT1664(auVar70);
  auVar65 = vsubps_avx(auVar65,auVar68);
  auVar241 = ZEXT1664(auVar65);
  auVar68 = vsubps_avx(*(undefined1 (*) [16])(lVar53 + (uVar59 + 3) * (long)p_Var3),auVar68);
  local_8e0 = vbroadcastss_avx512vl(auVar67);
  auVar257 = ZEXT3264(local_8e0);
  auVar76._8_4_ = 1;
  auVar76._0_8_ = 0x100000001;
  auVar76._12_4_ = 1;
  auVar76._16_4_ = 1;
  auVar76._20_4_ = 1;
  auVar76._24_4_ = 1;
  auVar76._28_4_ = 1;
  local_680 = ZEXT1632(auVar67);
  local_900 = vpermps_avx512vl(auVar76,local_680);
  auVar258 = ZEXT3264(local_900);
  auVar77._8_4_ = 2;
  auVar77._0_8_ = 0x200000002;
  auVar77._12_4_ = 2;
  auVar77._16_4_ = 2;
  auVar77._20_4_ = 2;
  auVar77._24_4_ = 2;
  auVar77._28_4_ = 2;
  local_800 = vpermps_avx512vl(auVar77,local_680);
  auVar259 = ZEXT3264(local_800);
  auVar78._8_4_ = 3;
  auVar78._0_8_ = 0x300000003;
  auVar78._12_4_ = 3;
  auVar78._16_4_ = 3;
  auVar78._20_4_ = 3;
  auVar78._24_4_ = 3;
  auVar78._28_4_ = 3;
  local_920 = vpermps_avx512vl(auVar78,local_680);
  auVar260 = ZEXT3264(local_920);
  local_820 = vbroadcastss_avx512vl(auVar65);
  auVar261 = ZEXT3264(local_820);
  local_6c0 = ZEXT1632(auVar65);
  local_940 = vpermps_avx512vl(auVar76,local_6c0);
  auVar262 = ZEXT3264(local_940);
  local_960 = vpermps_avx512vl(auVar77,local_6c0);
  auVar263 = ZEXT3264(local_960);
  local_840 = vpermps_avx512vl(auVar78,local_6c0);
  auVar264 = ZEXT3264(local_840);
  local_860 = vbroadcastss_avx512vl(auVar70);
  auVar265 = ZEXT3264(local_860);
  local_6a0 = ZEXT1632(auVar70);
  local_880 = vpermps_avx512vl(auVar76,local_6a0);
  auVar266 = ZEXT3264(local_880);
  local_280 = vpermps_avx512vl(auVar77,local_6a0);
  local_2a0 = vpermps_avx512vl(auVar78,local_6a0);
  local_260 = vbroadcastss_avx512vl(auVar68);
  _local_6e0 = ZEXT1632(auVar68);
  local_2e0 = vpermps_avx2(auVar76,_local_6e0);
  local_220 = vpermps_avx2(auVar77,_local_6e0);
  local_300 = vpermps_avx2(auVar78,_local_6e0);
  auVar67 = vfmadd231ps_fma(ZEXT432((uint)(fVar129 * fVar129)),local_460,local_460);
  auVar67 = vfmadd231ps_fma(ZEXT1632(auVar67),_local_440,_local_440);
  local_240._0_4_ = auVar67._0_4_;
  local_240._4_4_ = local_240._0_4_;
  local_240._8_4_ = local_240._0_4_;
  local_240._12_4_ = local_240._0_4_;
  local_240._16_4_ = local_240._0_4_;
  local_240._20_4_ = local_240._0_4_;
  local_240._24_4_ = local_240._0_4_;
  local_240._28_4_ = local_240._0_4_;
  auVar75._8_4_ = 0x7fffffff;
  auVar75._0_8_ = 0x7fffffff7fffffff;
  auVar75._12_4_ = 0x7fffffff;
  auVar75._16_4_ = 0x7fffffff;
  auVar75._20_4_ = 0x7fffffff;
  auVar75._24_4_ = 0x7fffffff;
  auVar75._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_240,auVar75);
  local_630 = ZEXT416((uint)local_320);
  local_320 = fVar147 - local_320;
  fStack_31c = local_320;
  fStack_318 = local_320;
  fStack_314 = local_320;
  fStack_310 = local_320;
  fStack_30c = local_320;
  fStack_308 = local_320;
  fStack_304 = local_320;
  local_530 = vpbroadcastd_avx512vl();
  local_a1c = 1;
  uVar54 = 0;
  bVar56 = false;
  local_540 = vpbroadcastd_avx512vl();
  auVar67 = vsqrtss_avx(local_700,local_700);
  local_984 = auVar67._0_4_;
  auVar67 = vsqrtss_avx(local_700,local_700);
  local_988 = auVar67._0_4_;
  local_3d0 = ZEXT816(0x3f80000000000000);
  local_2c0 = local_260;
  do {
    auVar67 = vmovshdup_avx(local_3d0);
    auVar67 = vsubps_avx(auVar67,local_3d0);
    local_8c0._0_4_ = auVar67._0_4_;
    fVar129 = local_8c0._0_4_ * 0.04761905;
    uVar148 = local_3d0._0_4_;
    local_8a0._4_4_ = uVar148;
    local_8a0._0_4_ = uVar148;
    local_8a0._8_4_ = uVar148;
    local_8a0._12_4_ = uVar148;
    local_8a0._16_4_ = uVar148;
    local_8a0._20_4_ = uVar148;
    local_8a0._24_4_ = uVar148;
    local_8a0._28_4_ = uVar148;
    local_8c0._4_4_ = local_8c0._0_4_;
    local_8c0._8_4_ = local_8c0._0_4_;
    local_8c0._12_4_ = local_8c0._0_4_;
    local_8c0._16_4_ = local_8c0._0_4_;
    local_8c0._20_4_ = local_8c0._0_4_;
    local_8c0._24_4_ = local_8c0._0_4_;
    local_8c0._28_4_ = local_8c0._0_4_;
    auVar67 = vfmadd231ps_fma(local_8a0,local_8c0,_DAT_01faff20);
    auVar75 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar75 = vsubps_avx512vl(auVar75,ZEXT1632(auVar67));
    fVar190 = auVar67._0_4_;
    fVar205 = auVar67._4_4_;
    fVar206 = auVar67._8_4_;
    fVar207 = auVar67._12_4_;
    fVar209 = auVar75._0_4_;
    fVar210 = auVar75._4_4_;
    fVar211 = auVar75._8_4_;
    fVar216 = auVar75._12_4_;
    fVar217 = auVar75._16_4_;
    fVar218 = auVar75._20_4_;
    fVar219 = auVar75._24_4_;
    auVar80._4_4_ = fVar210 * fVar210 * -fVar205;
    auVar80._0_4_ = fVar209 * fVar209 * -fVar190;
    auVar80._8_4_ = fVar211 * fVar211 * -fVar206;
    auVar80._12_4_ = fVar216 * fVar216 * -fVar207;
    auVar80._16_4_ = fVar217 * fVar217 * -0.0;
    auVar80._20_4_ = fVar218 * fVar218 * -0.0;
    auVar80._24_4_ = fVar219 * fVar219 * -0.0;
    auVar80._28_4_ = 0x80000000;
    auVar236._0_28_ =
         ZEXT1628(CONCAT412(fVar207 * fVar207,
                            CONCAT48(fVar206 * fVar206,CONCAT44(fVar205 * fVar205,fVar190 * fVar190)
                                    )));
    fVar237 = fVar190 * 3.0;
    fVar242 = fVar205 * 3.0;
    fVar243 = fVar206 * 3.0;
    fVar244 = fVar207 * 3.0;
    auVar231._28_36_ = auVar241._28_36_;
    auVar231._0_28_ = ZEXT1628(CONCAT412(fVar244,CONCAT48(fVar243,CONCAT44(fVar242,fVar237))));
    auVar97._0_4_ = (fVar237 + -5.0) * fVar190 * fVar190;
    auVar97._4_4_ = (fVar242 + -5.0) * fVar205 * fVar205;
    auVar97._8_4_ = (fVar243 + -5.0) * fVar206 * fVar206;
    auVar97._12_4_ = (fVar244 + -5.0) * fVar207 * fVar207;
    auVar97._16_4_ = 0x80000000;
    auVar97._20_4_ = 0x80000000;
    auVar97._24_4_ = 0x80000000;
    auVar97._28_4_ = 0;
    auVar76 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
    auVar77 = vaddps_avx512vl(auVar97,auVar76);
    auVar246._0_4_ = fVar209 * fVar209;
    auVar246._4_4_ = fVar210 * fVar210;
    auVar246._8_4_ = fVar211 * fVar211;
    auVar246._12_4_ = fVar216 * fVar216;
    auVar246._16_4_ = fVar217 * fVar217;
    auVar246._20_4_ = fVar218 * fVar218;
    auVar246._28_36_ = auVar245._28_36_;
    auVar246._24_4_ = fVar219 * fVar219;
    auVar83._4_4_ = auVar246._4_4_ * (fVar210 * 3.0 + -5.0);
    auVar83._0_4_ = auVar246._0_4_ * (fVar209 * 3.0 + -5.0);
    auVar83._8_4_ = auVar246._8_4_ * (fVar211 * 3.0 + -5.0);
    auVar83._12_4_ = auVar246._12_4_ * (fVar216 * 3.0 + -5.0);
    auVar83._16_4_ = auVar246._16_4_ * (fVar217 * 3.0 + -5.0);
    auVar83._20_4_ = auVar246._20_4_ * (fVar218 * 3.0 + -5.0);
    auVar83._24_4_ = auVar246._24_4_ * (fVar219 * 3.0 + -5.0);
    auVar83._28_4_ = auVar247._28_4_ + -5.0;
    auVar78 = vaddps_avx512vl(auVar83,auVar76);
    fVar208 = auVar75._28_4_;
    auVar84._4_4_ = fVar205 * fVar205 * -fVar210;
    auVar84._0_4_ = fVar190 * fVar190 * -fVar209;
    auVar84._8_4_ = fVar206 * fVar206 * -fVar211;
    auVar84._12_4_ = fVar207 * fVar207 * -fVar216;
    auVar84._16_4_ = -fVar217 * 0.0 * 0.0;
    auVar84._20_4_ = -fVar218 * 0.0 * 0.0;
    auVar84._24_4_ = -fVar219 * 0.0 * 0.0;
    auVar84._28_4_ = -fVar208;
    auVar79 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar75 = vmulps_avx512vl(auVar80,auVar79);
    auVar80 = vmulps_avx512vl(auVar77,auVar79);
    auVar78 = vmulps_avx512vl(auVar78,auVar79);
    auVar81 = vmulps_avx512vl(auVar84,auVar79);
    auVar82 = vmulps_avx512vl(local_2c0,auVar81);
    auVar85._4_4_ = local_2e0._4_4_ * auVar81._4_4_;
    auVar85._0_4_ = local_2e0._0_4_ * auVar81._0_4_;
    auVar85._8_4_ = local_2e0._8_4_ * auVar81._8_4_;
    auVar85._12_4_ = local_2e0._12_4_ * auVar81._12_4_;
    auVar85._16_4_ = local_2e0._16_4_ * auVar81._16_4_;
    auVar85._20_4_ = local_2e0._20_4_ * auVar81._20_4_;
    auVar85._24_4_ = local_2e0._24_4_ * auVar81._24_4_;
    auVar85._28_4_ = auVar77._28_4_;
    auVar77 = vmulps_avx512vl(local_220,auVar81);
    auVar86._4_4_ = local_300._4_4_ * auVar81._4_4_;
    auVar86._0_4_ = local_300._0_4_ * auVar81._0_4_;
    auVar86._8_4_ = local_300._8_4_ * auVar81._8_4_;
    auVar86._12_4_ = local_300._12_4_ * auVar81._12_4_;
    auVar86._16_4_ = local_300._16_4_ * auVar81._16_4_;
    auVar86._20_4_ = local_300._20_4_ * auVar81._20_4_;
    auVar86._24_4_ = local_300._24_4_ * auVar81._24_4_;
    auVar86._28_4_ = auVar81._28_4_;
    auVar81 = vfmadd231ps_avx512vl(auVar82,auVar78,auVar265._0_32_);
    auVar82 = vfmadd231ps_avx512vl(auVar85,auVar78,auVar266._0_32_);
    auVar77 = vfmadd231ps_avx512vl(auVar77,auVar78,local_280);
    auVar78 = vfmadd231ps_avx512vl(auVar86,local_2a0,auVar78);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar80,auVar261._0_32_);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar80,auVar262._0_32_);
    auVar77 = vfmadd231ps_avx512vl(auVar77,auVar80,auVar263._0_32_);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar264._0_32_,auVar80);
    auVar83 = vfmadd231ps_avx512vl(auVar81,auVar75,auVar257._0_32_);
    auVar84 = vfmadd231ps_avx512vl(auVar82,auVar75,auVar258._0_32_);
    auVar85 = vfmadd231ps_avx512vl(auVar77,auVar75,auVar259._0_32_);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar260._0_32_,auVar75);
    auVar87._4_4_ = (fVar210 + fVar210) * fVar205;
    auVar87._0_4_ = (fVar209 + fVar209) * fVar190;
    auVar87._8_4_ = (fVar211 + fVar211) * fVar206;
    auVar87._12_4_ = (fVar216 + fVar216) * fVar207;
    auVar87._16_4_ = (fVar217 + fVar217) * 0.0;
    auVar87._20_4_ = (fVar218 + fVar218) * 0.0;
    auVar87._24_4_ = (fVar219 + fVar219) * 0.0;
    auVar87._28_4_ = auVar80._28_4_;
    auVar75 = vsubps_avx(auVar87,auVar246._0_32_);
    auVar98._0_28_ =
         ZEXT1628(CONCAT412((fVar207 + fVar207) * (fVar244 + -5.0) + fVar244 * fVar207,
                            CONCAT48((fVar206 + fVar206) * (fVar243 + -5.0) + fVar243 * fVar206,
                                     CONCAT44((fVar205 + fVar205) * (fVar242 + -5.0) +
                                              fVar242 * fVar205,
                                              (fVar190 + fVar190) * (fVar237 + -5.0) +
                                              fVar237 * fVar190))));
    auVar98._28_4_ = auVar241._28_4_ + -5.0 + 0.0;
    auVar76 = vaddps_avx512vl(auVar231._0_32_,auVar76);
    auVar88._4_4_ = (fVar210 + fVar210) * auVar76._4_4_;
    auVar88._0_4_ = (fVar209 + fVar209) * auVar76._0_4_;
    auVar88._8_4_ = (fVar211 + fVar211) * auVar76._8_4_;
    auVar88._12_4_ = (fVar216 + fVar216) * auVar76._12_4_;
    auVar88._16_4_ = (fVar217 + fVar217) * auVar76._16_4_;
    auVar88._20_4_ = (fVar218 + fVar218) * auVar76._20_4_;
    auVar88._24_4_ = (fVar219 + fVar219) * auVar76._24_4_;
    auVar88._28_4_ = auVar76._28_4_;
    auVar89._4_4_ = fVar210 * 3.0 * fVar210;
    auVar89._0_4_ = fVar209 * 3.0 * fVar209;
    auVar89._8_4_ = fVar211 * 3.0 * fVar211;
    auVar89._12_4_ = fVar216 * 3.0 * fVar216;
    auVar89._16_4_ = fVar217 * 3.0 * fVar217;
    auVar89._20_4_ = fVar218 * 3.0 * fVar218;
    auVar89._24_4_ = fVar219 * 3.0 * fVar219;
    auVar89._28_4_ = fVar208;
    auVar76 = vsubps_avx(auVar88,auVar89);
    auVar77 = vsubps_avx(auVar236._0_32_,auVar87);
    auVar81 = vmulps_avx512vl(auVar75,auVar79);
    auVar82 = vmulps_avx512vl(auVar98,auVar79);
    auVar76 = vmulps_avx512vl(auVar76,auVar79);
    auVar77 = vmulps_avx512vl(auVar77,auVar79);
    auVar79 = vmulps_avx512vl(local_2c0,auVar77);
    auVar90._4_4_ = local_2e0._4_4_ * auVar77._4_4_;
    auVar90._0_4_ = local_2e0._0_4_ * auVar77._0_4_;
    auVar90._8_4_ = local_2e0._8_4_ * auVar77._8_4_;
    auVar90._12_4_ = local_2e0._12_4_ * auVar77._12_4_;
    auVar90._16_4_ = local_2e0._16_4_ * auVar77._16_4_;
    auVar90._20_4_ = local_2e0._20_4_ * auVar77._20_4_;
    auVar90._24_4_ = local_2e0._24_4_ * auVar77._24_4_;
    auVar90._28_4_ = auVar75._28_4_;
    auVar75 = vmulps_avx512vl(local_220,auVar77);
    auVar91._4_4_ = local_300._4_4_ * auVar77._4_4_;
    auVar91._0_4_ = local_300._0_4_ * auVar77._0_4_;
    auVar91._8_4_ = local_300._8_4_ * auVar77._8_4_;
    auVar91._12_4_ = local_300._12_4_ * auVar77._12_4_;
    auVar91._16_4_ = local_300._16_4_ * auVar77._16_4_;
    auVar91._20_4_ = local_300._20_4_ * auVar77._20_4_;
    auVar91._24_4_ = local_300._24_4_ * auVar77._24_4_;
    auVar91._28_4_ = auVar77._28_4_;
    auVar77 = vfmadd231ps_avx512vl(auVar79,auVar76,auVar265._0_32_);
    auVar79 = vfmadd231ps_avx512vl(auVar90,auVar76,auVar266._0_32_);
    auVar75 = vfmadd231ps_avx512vl(auVar75,auVar76,local_280);
    auVar76 = vfmadd231ps_avx512vl(auVar91,local_2a0,auVar76);
    auVar77 = vfmadd231ps_avx512vl(auVar77,auVar82,auVar261._0_32_);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar82,auVar262._0_32_);
    auVar75 = vfmadd231ps_avx512vl(auVar75,auVar82,auVar263._0_32_);
    auVar76 = vfmadd231ps_avx512vl(auVar76,auVar264._0_32_,auVar82);
    auVar77 = vfmadd231ps_avx512vl(auVar77,auVar81,auVar257._0_32_);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar81,auVar258._0_32_);
    auVar75 = vfmadd231ps_avx512vl(auVar75,auVar81,auVar259._0_32_);
    auVar76 = vfmadd231ps_avx512vl(auVar76,auVar260._0_32_,auVar81);
    auVar104._4_4_ = auVar77._4_4_ * fVar129;
    auVar104._0_4_ = auVar77._0_4_ * fVar129;
    auVar104._8_4_ = auVar77._8_4_ * fVar129;
    auVar104._12_4_ = auVar77._12_4_ * fVar129;
    auVar104._16_4_ = auVar77._16_4_ * fVar129;
    auVar104._20_4_ = auVar77._20_4_ * fVar129;
    auVar104._24_4_ = auVar77._24_4_ * fVar129;
    auVar104._28_4_ = fVar208 + fVar208;
    auVar105._4_4_ = auVar79._4_4_ * fVar129;
    auVar105._0_4_ = auVar79._0_4_ * fVar129;
    auVar105._8_4_ = auVar79._8_4_ * fVar129;
    auVar105._12_4_ = auVar79._12_4_ * fVar129;
    auVar105._16_4_ = auVar79._16_4_ * fVar129;
    auVar105._20_4_ = auVar79._20_4_ * fVar129;
    auVar105._24_4_ = auVar79._24_4_ * fVar129;
    auVar105._28_4_ = auVar80._28_4_;
    auVar106._4_4_ = auVar75._4_4_ * fVar129;
    auVar106._0_4_ = auVar75._0_4_ * fVar129;
    auVar106._8_4_ = auVar75._8_4_ * fVar129;
    auVar106._12_4_ = auVar75._12_4_ * fVar129;
    auVar106._16_4_ = auVar75._16_4_ * fVar129;
    auVar106._20_4_ = auVar75._20_4_ * fVar129;
    auVar106._24_4_ = auVar75._24_4_ * fVar129;
    auVar106._28_4_ = 0;
    fVar190 = fVar129 * auVar76._0_4_;
    fVar205 = fVar129 * auVar76._4_4_;
    auVar95._4_4_ = fVar205;
    auVar95._0_4_ = fVar190;
    fVar206 = fVar129 * auVar76._8_4_;
    auVar95._8_4_ = fVar206;
    fVar207 = fVar129 * auVar76._12_4_;
    auVar95._12_4_ = fVar207;
    fVar208 = fVar129 * auVar76._16_4_;
    auVar95._16_4_ = fVar208;
    fVar209 = fVar129 * auVar76._20_4_;
    auVar95._20_4_ = fVar209;
    fVar210 = fVar129 * auVar76._24_4_;
    auVar95._24_4_ = fVar210;
    auVar95._28_4_ = fVar129;
    auVar67 = vxorps_avx512vl(auVar264._0_16_,auVar264._0_16_);
    auVar86 = vpermt2ps_avx512vl(auVar83,_DAT_01feed00,ZEXT1632(auVar67));
    auVar87 = vpermt2ps_avx512vl(auVar84,_DAT_01feed00,ZEXT1632(auVar67));
    auVar245 = ZEXT3264(auVar87);
    auVar77 = ZEXT1632(auVar67);
    auVar88 = vpermt2ps_avx512vl(auVar85,_DAT_01feed00,auVar77);
    auVar247 = ZEXT3264(auVar88);
    auVar99._0_4_ = auVar78._0_4_ + fVar190;
    auVar99._4_4_ = auVar78._4_4_ + fVar205;
    auVar99._8_4_ = auVar78._8_4_ + fVar206;
    auVar99._12_4_ = auVar78._12_4_ + fVar207;
    auVar99._16_4_ = auVar78._16_4_ + fVar208;
    auVar99._20_4_ = auVar78._20_4_ + fVar209;
    auVar99._24_4_ = auVar78._24_4_ + fVar210;
    auVar99._28_4_ = auVar78._28_4_ + fVar129;
    auVar75 = vmaxps_avx(auVar78,auVar99);
    auVar76 = vminps_avx(auVar78,auVar99);
    auVar81 = vpermt2ps_avx512vl(auVar78,_DAT_01feed00,auVar77);
    auVar89 = vpermt2ps_avx512vl(auVar104,_DAT_01feed00,auVar77);
    auVar241 = ZEXT3264(auVar89);
    auVar90 = vpermt2ps_avx512vl(auVar105,_DAT_01feed00,auVar77);
    auVar100 = ZEXT1632(auVar67);
    auVar91 = vpermt2ps_avx512vl(auVar106,_DAT_01feed00,auVar100);
    auVar77 = vpermt2ps_avx512vl(auVar95,_DAT_01feed00,auVar100);
    auVar82 = vsubps_avx512vl(auVar81,auVar77);
    auVar77 = vsubps_avx(auVar86,auVar83);
    auVar236 = ZEXT3264(auVar77);
    auVar78 = vsubps_avx(auVar87,auVar84);
    auVar80 = vsubps_avx(auVar88,auVar85);
    auVar79 = vmulps_avx512vl(auVar78,auVar106);
    auVar79 = vfmsub231ps_avx512vl(auVar79,auVar105,auVar80);
    auVar92 = vmulps_avx512vl(auVar80,auVar104);
    auVar92 = vfmsub231ps_avx512vl(auVar92,auVar106,auVar77);
    auVar93 = vmulps_avx512vl(auVar77,auVar105);
    auVar93 = vfmsub231ps_avx512vl(auVar93,auVar104,auVar78);
    auVar93 = vmulps_avx512vl(auVar93,auVar93);
    auVar92 = vfmadd231ps_avx512vl(auVar93,auVar92,auVar92);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar79,auVar79);
    auVar79 = vmulps_avx512vl(auVar80,auVar80);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar78,auVar78);
    auVar93 = vfmadd231ps_avx512vl(auVar79,auVar77,auVar77);
    auVar94 = vrcp14ps_avx512vl(auVar93);
    auVar79._8_4_ = 0x3f800000;
    auVar79._0_8_ = 0x3f8000003f800000;
    auVar79._12_4_ = 0x3f800000;
    auVar79._16_4_ = 0x3f800000;
    auVar79._20_4_ = 0x3f800000;
    auVar79._24_4_ = 0x3f800000;
    auVar79._28_4_ = 0x3f800000;
    auVar79 = vfnmadd213ps_avx512vl(auVar94,auVar93,auVar79);
    auVar79 = vfmadd132ps_avx512vl(auVar79,auVar94,auVar94);
    auVar92 = vmulps_avx512vl(auVar92,auVar79);
    auVar94 = vmulps_avx512vl(auVar78,auVar91);
    auVar94 = vfmsub231ps_avx512vl(auVar94,auVar90,auVar80);
    auVar95 = vmulps_avx512vl(auVar80,auVar89);
    auVar95 = vfmsub231ps_avx512vl(auVar95,auVar91,auVar77);
    auVar96 = vmulps_avx512vl(auVar77,auVar90);
    auVar96 = vfmsub231ps_avx512vl(auVar96,auVar89,auVar78);
    auVar96 = vmulps_avx512vl(auVar96,auVar96);
    auVar95 = vfmadd231ps_avx512vl(auVar96,auVar95,auVar95);
    auVar94 = vfmadd231ps_avx512vl(auVar95,auVar94,auVar94);
    auVar79 = vmulps_avx512vl(auVar94,auVar79);
    auVar79 = vmaxps_avx512vl(auVar92,auVar79);
    auVar79 = vsqrtps_avx512vl(auVar79);
    auVar92 = vmaxps_avx512vl(auVar82,auVar81);
    auVar75 = vmaxps_avx512vl(auVar75,auVar92);
    auVar94 = vaddps_avx512vl(auVar79,auVar75);
    auVar75 = vminps_avx512vl(auVar82,auVar81);
    auVar75 = vminps_avx(auVar76,auVar75);
    auVar75 = vsubps_avx512vl(auVar75,auVar79);
    auVar81._8_4_ = 0x3f800002;
    auVar81._0_8_ = 0x3f8000023f800002;
    auVar81._12_4_ = 0x3f800002;
    auVar81._16_4_ = 0x3f800002;
    auVar81._20_4_ = 0x3f800002;
    auVar81._24_4_ = 0x3f800002;
    auVar81._28_4_ = 0x3f800002;
    auVar76 = vmulps_avx512vl(auVar94,auVar81);
    auVar82._8_4_ = 0x3f7ffffc;
    auVar82._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar82._12_4_ = 0x3f7ffffc;
    auVar82._16_4_ = 0x3f7ffffc;
    auVar82._20_4_ = 0x3f7ffffc;
    auVar82._24_4_ = 0x3f7ffffc;
    auVar82._28_4_ = 0x3f7ffffc;
    auVar75 = vmulps_avx512vl(auVar75,auVar82);
    auVar76 = vmulps_avx512vl(auVar76,auVar76);
    auVar79 = vrsqrt14ps_avx512vl(auVar93);
    auVar92._8_4_ = 0xbf000000;
    auVar92._0_8_ = 0xbf000000bf000000;
    auVar92._12_4_ = 0xbf000000;
    auVar92._16_4_ = 0xbf000000;
    auVar92._20_4_ = 0xbf000000;
    auVar92._24_4_ = 0xbf000000;
    auVar92._28_4_ = 0xbf000000;
    auVar81 = vmulps_avx512vl(auVar93,auVar92);
    fVar129 = auVar79._0_4_;
    fVar190 = auVar79._4_4_;
    fVar205 = auVar79._8_4_;
    fVar206 = auVar79._12_4_;
    fVar207 = auVar79._16_4_;
    fVar208 = auVar79._20_4_;
    fVar209 = auVar79._24_4_;
    auVar96._4_4_ = fVar190 * fVar190 * fVar190 * auVar81._4_4_;
    auVar96._0_4_ = fVar129 * fVar129 * fVar129 * auVar81._0_4_;
    auVar96._8_4_ = fVar205 * fVar205 * fVar205 * auVar81._8_4_;
    auVar96._12_4_ = fVar206 * fVar206 * fVar206 * auVar81._12_4_;
    auVar96._16_4_ = fVar207 * fVar207 * fVar207 * auVar81._16_4_;
    auVar96._20_4_ = fVar208 * fVar208 * fVar208 * auVar81._20_4_;
    auVar96._24_4_ = fVar209 * fVar209 * fVar209 * auVar81._24_4_;
    auVar96._28_4_ = auVar94._28_4_;
    auVar93._8_4_ = 0x3fc00000;
    auVar93._0_8_ = 0x3fc000003fc00000;
    auVar93._12_4_ = 0x3fc00000;
    auVar93._16_4_ = 0x3fc00000;
    auVar93._20_4_ = 0x3fc00000;
    auVar93._24_4_ = 0x3fc00000;
    auVar93._28_4_ = 0x3fc00000;
    auVar79 = vfmadd231ps_avx512vl(auVar96,auVar79,auVar93);
    auVar81 = vmulps_avx512vl(auVar77,auVar79);
    auVar82 = vmulps_avx512vl(auVar78,auVar79);
    auVar92 = vmulps_avx512vl(auVar80,auVar79);
    auVar93 = vsubps_avx512vl(auVar100,auVar83);
    auVar95 = vsubps_avx512vl(auVar100,auVar84);
    auVar96 = vsubps_avx512vl(auVar100,auVar85);
    auVar94 = vmulps_avx512vl(local_480,auVar96);
    auVar94 = vfmadd231ps_avx512vl(auVar94,local_460,auVar95);
    auVar94 = vfmadd231ps_avx512vl(auVar94,_local_440,auVar93);
    auVar97 = vmulps_avx512vl(auVar96,auVar96);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar95,auVar95);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,auVar93);
    auVar98 = vmulps_avx512vl(local_480,auVar92);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar82,local_460);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar81,_local_440);
    auVar92 = vmulps_avx512vl(auVar96,auVar92);
    auVar82 = vfmadd231ps_avx512vl(auVar92,auVar95,auVar82);
    auVar81 = vfmadd231ps_avx512vl(auVar82,auVar93,auVar81);
    auVar82 = vmulps_avx512vl(auVar98,auVar98);
    auVar92 = vsubps_avx512vl(local_240,auVar82);
    auVar99 = vmulps_avx512vl(auVar98,auVar81);
    auVar94 = vsubps_avx512vl(auVar94,auVar99);
    auVar99 = vaddps_avx512vl(auVar94,auVar94);
    auVar94 = vmulps_avx512vl(auVar81,auVar81);
    local_660 = vsubps_avx512vl(auVar97,auVar94);
    auVar76 = vsubps_avx512vl(local_660,auVar76);
    local_7c0 = vmulps_avx512vl(auVar99,auVar99);
    auVar94._8_4_ = 0x40800000;
    auVar94._0_8_ = 0x4080000040800000;
    auVar94._12_4_ = 0x40800000;
    auVar94._16_4_ = 0x40800000;
    auVar94._20_4_ = 0x40800000;
    auVar94._24_4_ = 0x40800000;
    auVar94._28_4_ = 0x40800000;
    _local_580 = vmulps_avx512vl(auVar92,auVar94);
    auVar94 = vmulps_avx512vl(_local_580,auVar76);
    auVar94 = vsubps_avx512vl(local_7c0,auVar94);
    uVar59 = vcmpps_avx512vl(auVar94,auVar100,5);
    bVar49 = (byte)uVar59;
    fVar129 = (float)local_980._0_4_;
    fVar190 = (float)local_980._4_4_;
    fVar205 = fStack_978;
    fVar206 = fStack_974;
    fVar207 = fStack_970;
    fVar208 = fStack_96c;
    fVar209 = fStack_968;
    fVar210 = fStack_964;
    if (bVar49 == 0) {
LAB_01abf55b:
      auVar257 = ZEXT3264(local_8e0);
      auVar258 = ZEXT3264(local_900);
      auVar259 = ZEXT3264(local_800);
      auVar260 = ZEXT3264(local_920);
      auVar261 = ZEXT3264(local_820);
      auVar262 = ZEXT3264(local_940);
      auVar263 = ZEXT3264(local_960);
      auVar264 = ZEXT3264(local_840);
      auVar265 = ZEXT3264(local_860);
      auVar266 = ZEXT3264(local_880);
    }
    else {
      auVar94 = vsqrtps_avx512vl(auVar94);
      auVar97 = vaddps_avx512vl(auVar92,auVar92);
      local_5a0 = vrcp14ps_avx512vl(auVar97);
      auVar100._8_4_ = 0x3f800000;
      auVar100._0_8_ = 0x3f8000003f800000;
      auVar100._12_4_ = 0x3f800000;
      auVar100._16_4_ = 0x3f800000;
      auVar100._20_4_ = 0x3f800000;
      auVar100._24_4_ = 0x3f800000;
      auVar100._28_4_ = 0x3f800000;
      auVar100 = vfnmadd213ps_avx512vl(local_5a0,auVar97,auVar100);
      auVar100 = vfmadd132ps_avx512vl(auVar100,local_5a0,local_5a0);
      auVar101._8_4_ = 0x80000000;
      auVar101._0_8_ = 0x8000000080000000;
      auVar101._12_4_ = 0x80000000;
      auVar101._16_4_ = 0x80000000;
      auVar101._20_4_ = 0x80000000;
      auVar101._24_4_ = 0x80000000;
      auVar101._28_4_ = 0x80000000;
      local_5c0 = vxorps_avx512vl(auVar99,auVar101);
      auVar101 = vsubps_avx512vl(local_5c0,auVar94);
      local_7e0 = vmulps_avx512vl(auVar101,auVar100);
      auVar94 = vsubps_avx512vl(auVar94,auVar99);
      local_5e0 = vmulps_avx512vl(auVar94,auVar100);
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar100 = vblendmps_avx512vl(auVar94,local_7e0);
      auVar102._0_4_ =
           (uint)(bVar49 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar49 & 1) * auVar94._0_4_;
      bVar58 = (bool)((byte)(uVar59 >> 1) & 1);
      auVar102._4_4_ = (uint)bVar58 * auVar100._4_4_ | (uint)!bVar58 * auVar94._4_4_;
      bVar58 = (bool)((byte)(uVar59 >> 2) & 1);
      auVar102._8_4_ = (uint)bVar58 * auVar100._8_4_ | (uint)!bVar58 * auVar94._8_4_;
      bVar58 = (bool)((byte)(uVar59 >> 3) & 1);
      auVar102._12_4_ = (uint)bVar58 * auVar100._12_4_ | (uint)!bVar58 * auVar94._12_4_;
      bVar58 = (bool)((byte)(uVar59 >> 4) & 1);
      auVar102._16_4_ = (uint)bVar58 * auVar100._16_4_ | (uint)!bVar58 * auVar94._16_4_;
      bVar58 = (bool)((byte)(uVar59 >> 5) & 1);
      auVar102._20_4_ = (uint)bVar58 * auVar100._20_4_ | (uint)!bVar58 * auVar94._20_4_;
      bVar58 = (bool)((byte)(uVar59 >> 6) & 1);
      auVar102._24_4_ = (uint)bVar58 * auVar100._24_4_ | (uint)!bVar58 * auVar94._24_4_;
      bVar58 = SUB81(uVar59 >> 7,0);
      auVar102._28_4_ = (uint)bVar58 * auVar100._28_4_ | (uint)!bVar58 * auVar94._28_4_;
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar100 = vblendmps_avx512vl(auVar94,local_5e0);
      auVar103._0_4_ =
           (uint)(bVar49 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar49 & 1) * auVar94._0_4_;
      bVar58 = (bool)((byte)(uVar59 >> 1) & 1);
      auVar103._4_4_ = (uint)bVar58 * auVar100._4_4_ | (uint)!bVar58 * auVar94._4_4_;
      bVar58 = (bool)((byte)(uVar59 >> 2) & 1);
      auVar103._8_4_ = (uint)bVar58 * auVar100._8_4_ | (uint)!bVar58 * auVar94._8_4_;
      bVar58 = (bool)((byte)(uVar59 >> 3) & 1);
      auVar103._12_4_ = (uint)bVar58 * auVar100._12_4_ | (uint)!bVar58 * auVar94._12_4_;
      bVar58 = (bool)((byte)(uVar59 >> 4) & 1);
      auVar103._16_4_ = (uint)bVar58 * auVar100._16_4_ | (uint)!bVar58 * auVar94._16_4_;
      bVar58 = (bool)((byte)(uVar59 >> 5) & 1);
      auVar103._20_4_ = (uint)bVar58 * auVar100._20_4_ | (uint)!bVar58 * auVar94._20_4_;
      bVar58 = (bool)((byte)(uVar59 >> 6) & 1);
      auVar103._24_4_ = (uint)bVar58 * auVar100._24_4_ | (uint)!bVar58 * auVar94._24_4_;
      bVar58 = SUB81(uVar59 >> 7,0);
      auVar103._28_4_ = (uint)bVar58 * auVar100._28_4_ | (uint)!bVar58 * auVar94._28_4_;
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar82,auVar94);
      local_720 = vmaxps_avx512vl(local_260,auVar94);
      auVar26._8_4_ = 0x36000000;
      auVar26._0_8_ = 0x3600000036000000;
      auVar26._12_4_ = 0x36000000;
      auVar26._16_4_ = 0x36000000;
      auVar26._20_4_ = 0x36000000;
      auVar26._24_4_ = 0x36000000;
      auVar26._28_4_ = 0x36000000;
      local_740 = vmulps_avx512vl(local_720,auVar26);
      vandps_avx512vl(auVar92,auVar94);
      uVar60 = vcmpps_avx512vl(local_740,local_740,1);
      uVar59 = uVar59 & uVar60;
      bVar52 = (byte)uVar59;
      if (bVar52 != 0) {
        uVar60 = vcmpps_avx512vl(auVar76,_DAT_01faff00,2);
        auVar76 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar82 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar92 = vblendmps_avx512vl(auVar76,auVar82);
        bVar51 = (byte)uVar60;
        uVar62 = (uint)(bVar51 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar51 & 1) * local_740._0_4_;
        bVar58 = (bool)((byte)(uVar60 >> 1) & 1);
        uVar61 = (uint)bVar58 * auVar92._4_4_ | (uint)!bVar58 * local_740._4_4_;
        bVar58 = (bool)((byte)(uVar60 >> 2) & 1);
        uVar122 = (uint)bVar58 * auVar92._8_4_ | (uint)!bVar58 * local_740._8_4_;
        bVar58 = (bool)((byte)(uVar60 >> 3) & 1);
        uVar123 = (uint)bVar58 * auVar92._12_4_ | (uint)!bVar58 * local_740._12_4_;
        bVar58 = (bool)((byte)(uVar60 >> 4) & 1);
        uVar124 = (uint)bVar58 * auVar92._16_4_ | (uint)!bVar58 * local_740._16_4_;
        bVar58 = (bool)((byte)(uVar60 >> 5) & 1);
        uVar125 = (uint)bVar58 * auVar92._20_4_ | (uint)!bVar58 * local_740._20_4_;
        bVar58 = (bool)((byte)(uVar60 >> 6) & 1);
        uVar126 = (uint)bVar58 * auVar92._24_4_ | (uint)!bVar58 * local_740._24_4_;
        bVar58 = SUB81(uVar60 >> 7,0);
        uVar127 = (uint)bVar58 * auVar92._28_4_ | (uint)!bVar58 * local_740._28_4_;
        auVar102._0_4_ = (bVar52 & 1) * uVar62 | !(bool)(bVar52 & 1) * auVar102._0_4_;
        bVar58 = (bool)((byte)(uVar59 >> 1) & 1);
        auVar102._4_4_ = bVar58 * uVar61 | !bVar58 * auVar102._4_4_;
        bVar58 = (bool)((byte)(uVar59 >> 2) & 1);
        auVar102._8_4_ = bVar58 * uVar122 | !bVar58 * auVar102._8_4_;
        bVar58 = (bool)((byte)(uVar59 >> 3) & 1);
        auVar102._12_4_ = bVar58 * uVar123 | !bVar58 * auVar102._12_4_;
        bVar58 = (bool)((byte)(uVar59 >> 4) & 1);
        auVar102._16_4_ = bVar58 * uVar124 | !bVar58 * auVar102._16_4_;
        bVar58 = (bool)((byte)(uVar59 >> 5) & 1);
        auVar102._20_4_ = bVar58 * uVar125 | !bVar58 * auVar102._20_4_;
        bVar58 = (bool)((byte)(uVar59 >> 6) & 1);
        auVar102._24_4_ = bVar58 * uVar126 | !bVar58 * auVar102._24_4_;
        bVar58 = SUB81(uVar59 >> 7,0);
        auVar102._28_4_ = bVar58 * uVar127 | !bVar58 * auVar102._28_4_;
        auVar76 = vblendmps_avx512vl(auVar82,auVar76);
        bVar58 = (bool)((byte)(uVar60 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar60 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar60 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar60 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar60 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar60 >> 6) & 1);
        bVar10 = SUB81(uVar60 >> 7,0);
        auVar103._0_4_ =
             (uint)(bVar52 & 1) *
             ((uint)(bVar51 & 1) * auVar76._0_4_ | !(bool)(bVar51 & 1) * uVar62) |
             !(bool)(bVar52 & 1) * auVar103._0_4_;
        bVar4 = (bool)((byte)(uVar59 >> 1) & 1);
        auVar103._4_4_ =
             (uint)bVar4 * ((uint)bVar58 * auVar76._4_4_ | !bVar58 * uVar61) |
             !bVar4 * auVar103._4_4_;
        bVar58 = (bool)((byte)(uVar59 >> 2) & 1);
        auVar103._8_4_ =
             (uint)bVar58 * ((uint)bVar5 * auVar76._8_4_ | !bVar5 * uVar122) |
             !bVar58 * auVar103._8_4_;
        bVar58 = (bool)((byte)(uVar59 >> 3) & 1);
        auVar103._12_4_ =
             (uint)bVar58 * ((uint)bVar6 * auVar76._12_4_ | !bVar6 * uVar123) |
             !bVar58 * auVar103._12_4_;
        bVar58 = (bool)((byte)(uVar59 >> 4) & 1);
        auVar103._16_4_ =
             (uint)bVar58 * ((uint)bVar7 * auVar76._16_4_ | !bVar7 * uVar124) |
             !bVar58 * auVar103._16_4_;
        bVar58 = (bool)((byte)(uVar59 >> 5) & 1);
        auVar103._20_4_ =
             (uint)bVar58 * ((uint)bVar8 * auVar76._20_4_ | !bVar8 * uVar125) |
             !bVar58 * auVar103._20_4_;
        bVar58 = (bool)((byte)(uVar59 >> 6) & 1);
        auVar103._24_4_ =
             (uint)bVar58 * ((uint)bVar9 * auVar76._24_4_ | !bVar9 * uVar126) |
             !bVar58 * auVar103._24_4_;
        bVar58 = SUB81(uVar59 >> 7,0);
        auVar103._28_4_ =
             (uint)bVar58 * ((uint)bVar10 * auVar76._28_4_ | !bVar10 * uVar127) |
             !bVar58 * auVar103._28_4_;
        bVar49 = (~bVar52 | bVar51) & bVar49;
      }
      if ((bVar49 & 0x7f) == 0) goto LAB_01abf55b;
      auVar76 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar82 = vxorps_avx512vl(auVar91,auVar76);
      auVar92 = vxorps_avx512vl(auVar89,auVar76);
      uVar62 = *(uint *)(ray + k * 4 + 0x80);
      auVar94 = vxorps_avx512vl(auVar90,auVar76);
      local_7a0 = ZEXT416(uVar62);
      auVar67 = vsubss_avx512f(local_7a0,ZEXT416((uint)local_630._0_4_));
      auVar89 = vbroadcastss_avx512vl(auVar67);
      auVar89 = vminps_avx512vl(auVar89,auVar103);
      auVar48._4_4_ = fStack_31c;
      auVar48._0_4_ = local_320;
      auVar48._8_4_ = fStack_318;
      auVar48._12_4_ = fStack_314;
      auVar48._16_4_ = fStack_310;
      auVar48._20_4_ = fStack_30c;
      auVar48._24_4_ = fStack_308;
      auVar48._28_4_ = fStack_304;
      auVar90 = vmaxps_avx512vl(auVar48,auVar102);
      auVar91 = vmulps_avx512vl(auVar96,auVar106);
      auVar91 = vfmadd213ps_avx512vl(auVar95,auVar105,auVar91);
      auVar67 = vfmadd213ps_fma(auVar93,auVar104,auVar91);
      auVar93 = vmulps_avx512vl(local_480,auVar106);
      auVar93 = vfmadd231ps_avx512vl(auVar93,local_460,auVar105);
      auVar65 = vfmadd231ps_fma(auVar93,_local_440,auVar104);
      auVar93 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(ZEXT1632(auVar65),auVar93);
      auVar91 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar12 = vcmpps_avx512vl(auVar93,auVar91,1);
      auVar104 = vxorps_avx512vl(ZEXT1632(auVar67),auVar76);
      auVar105 = vrcp14ps_avx512vl(ZEXT1632(auVar65));
      auVar101 = ZEXT1632(auVar65);
      auVar106 = vxorps_avx512vl(auVar101,auVar76);
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar96 = vfnmadd213ps_avx512vl(auVar105,auVar101,auVar95);
      auVar67 = vfmadd132ps_fma(auVar96,auVar105,auVar105);
      fVar211 = auVar67._0_4_ * auVar104._0_4_;
      fVar216 = auVar67._4_4_ * auVar104._4_4_;
      auVar31._4_4_ = fVar216;
      auVar31._0_4_ = fVar211;
      fVar217 = auVar67._8_4_ * auVar104._8_4_;
      auVar31._8_4_ = fVar217;
      fVar218 = auVar67._12_4_ * auVar104._12_4_;
      auVar31._12_4_ = fVar218;
      fVar219 = auVar104._16_4_ * 0.0;
      auVar31._16_4_ = fVar219;
      fVar237 = auVar104._20_4_ * 0.0;
      auVar31._20_4_ = fVar237;
      fVar242 = auVar104._24_4_ * 0.0;
      auVar31._24_4_ = fVar242;
      auVar31._28_4_ = auVar104._28_4_;
      uVar13 = vcmpps_avx512vl(auVar101,auVar106,1);
      bVar52 = (byte)uVar12 | (byte)uVar13;
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar100 = vblendmps_avx512vl(auVar31,auVar96);
      auVar107._0_4_ =
           (uint)(bVar52 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar105._0_4_;
      bVar58 = (bool)(bVar52 >> 1 & 1);
      auVar107._4_4_ = (uint)bVar58 * auVar100._4_4_ | (uint)!bVar58 * auVar105._4_4_;
      bVar58 = (bool)(bVar52 >> 2 & 1);
      auVar107._8_4_ = (uint)bVar58 * auVar100._8_4_ | (uint)!bVar58 * auVar105._8_4_;
      bVar58 = (bool)(bVar52 >> 3 & 1);
      auVar107._12_4_ = (uint)bVar58 * auVar100._12_4_ | (uint)!bVar58 * auVar105._12_4_;
      bVar58 = (bool)(bVar52 >> 4 & 1);
      auVar107._16_4_ = (uint)bVar58 * auVar100._16_4_ | (uint)!bVar58 * auVar105._16_4_;
      bVar58 = (bool)(bVar52 >> 5 & 1);
      auVar107._20_4_ = (uint)bVar58 * auVar100._20_4_ | (uint)!bVar58 * auVar105._20_4_;
      bVar58 = (bool)(bVar52 >> 6 & 1);
      auVar107._24_4_ = (uint)bVar58 * auVar100._24_4_ | (uint)!bVar58 * auVar105._24_4_;
      auVar107._28_4_ =
           (uint)(bVar52 >> 7) * auVar100._28_4_ | (uint)!(bool)(bVar52 >> 7) * auVar105._28_4_;
      auVar105 = vmaxps_avx512vl(auVar90,auVar107);
      uVar13 = vcmpps_avx512vl(auVar101,auVar106,6);
      bVar52 = (byte)uVar12 | (byte)uVar13;
      auVar108._0_4_ = (uint)(bVar52 & 1) * 0x7f800000 | (uint)!(bool)(bVar52 & 1) * (int)fVar211;
      bVar58 = (bool)(bVar52 >> 1 & 1);
      auVar108._4_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar216;
      bVar58 = (bool)(bVar52 >> 2 & 1);
      auVar108._8_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar217;
      bVar58 = (bool)(bVar52 >> 3 & 1);
      auVar108._12_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar218;
      bVar58 = (bool)(bVar52 >> 4 & 1);
      auVar108._16_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar219;
      bVar58 = (bool)(bVar52 >> 5 & 1);
      auVar108._20_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar237;
      bVar58 = (bool)(bVar52 >> 6 & 1);
      auVar108._24_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar242;
      auVar108._28_4_ =
           (uint)(bVar52 >> 7) * 0x7f800000 | (uint)!(bool)(bVar52 >> 7) * auVar104._28_4_;
      auVar104 = vminps_avx512vl(auVar89,auVar108);
      auVar67 = vxorps_avx512vl(auVar90._0_16_,auVar90._0_16_);
      auVar86 = vsubps_avx512vl(ZEXT1632(auVar67),auVar86);
      auVar87 = vsubps_avx512vl(ZEXT1632(auVar67),auVar87);
      auVar90 = ZEXT1632(auVar67);
      auVar88 = vsubps_avx512vl(auVar90,auVar88);
      auVar88 = vmulps_avx512vl(auVar88,auVar82);
      auVar87 = vfmadd231ps_avx512vl(auVar88,auVar94,auVar87);
      auVar86 = vfmadd231ps_avx512vl(auVar87,auVar92,auVar86);
      auVar82 = vmulps_avx512vl(local_480,auVar82);
      auVar82 = vfmadd231ps_avx512vl(auVar82,local_460,auVar94);
      auVar82 = vfmadd231ps_avx512vl(auVar82,_local_440,auVar92);
      vandps_avx512vl(auVar82,auVar93);
      uVar12 = vcmpps_avx512vl(auVar82,auVar91,1);
      auVar92 = vxorps_avx512vl(auVar86,auVar76);
      auVar93 = vrcp14ps_avx512vl(auVar82);
      auVar76 = vxorps_avx512vl(auVar82,auVar76);
      auVar247 = ZEXT3264(auVar76);
      auVar94 = vfnmadd213ps_avx512vl(auVar93,auVar82,auVar95);
      auVar67 = vfmadd132ps_fma(auVar94,auVar93,auVar93);
      fVar211 = auVar67._0_4_ * auVar92._0_4_;
      fVar216 = auVar67._4_4_ * auVar92._4_4_;
      auVar32._4_4_ = fVar216;
      auVar32._0_4_ = fVar211;
      fVar217 = auVar67._8_4_ * auVar92._8_4_;
      auVar32._8_4_ = fVar217;
      fVar218 = auVar67._12_4_ * auVar92._12_4_;
      auVar32._12_4_ = fVar218;
      fVar219 = auVar92._16_4_ * 0.0;
      auVar32._16_4_ = fVar219;
      fVar237 = auVar92._20_4_ * 0.0;
      auVar32._20_4_ = fVar237;
      fVar242 = auVar92._24_4_ * 0.0;
      auVar32._24_4_ = fVar242;
      auVar32._28_4_ = auVar92._28_4_;
      uVar13 = vcmpps_avx512vl(auVar82,auVar76,1);
      bVar52 = (byte)uVar12 | (byte)uVar13;
      auVar94 = vblendmps_avx512vl(auVar32,auVar96);
      auVar109._0_4_ =
           (uint)(bVar52 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar93._0_4_;
      bVar58 = (bool)(bVar52 >> 1 & 1);
      auVar109._4_4_ = (uint)bVar58 * auVar94._4_4_ | (uint)!bVar58 * auVar93._4_4_;
      bVar58 = (bool)(bVar52 >> 2 & 1);
      auVar109._8_4_ = (uint)bVar58 * auVar94._8_4_ | (uint)!bVar58 * auVar93._8_4_;
      bVar58 = (bool)(bVar52 >> 3 & 1);
      auVar109._12_4_ = (uint)bVar58 * auVar94._12_4_ | (uint)!bVar58 * auVar93._12_4_;
      bVar58 = (bool)(bVar52 >> 4 & 1);
      auVar109._16_4_ = (uint)bVar58 * auVar94._16_4_ | (uint)!bVar58 * auVar93._16_4_;
      bVar58 = (bool)(bVar52 >> 5 & 1);
      auVar109._20_4_ = (uint)bVar58 * auVar94._20_4_ | (uint)!bVar58 * auVar93._20_4_;
      bVar58 = (bool)(bVar52 >> 6 & 1);
      auVar109._24_4_ = (uint)bVar58 * auVar94._24_4_ | (uint)!bVar58 * auVar93._24_4_;
      auVar109._28_4_ =
           (uint)(bVar52 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar52 >> 7) * auVar93._28_4_;
      auVar245 = ZEXT3264(auVar109);
      _local_760 = vmaxps_avx(auVar105,auVar109);
      auVar241 = ZEXT3264(_local_760);
      uVar13 = vcmpps_avx512vl(auVar82,auVar76,6);
      bVar52 = (byte)uVar12 | (byte)uVar13;
      auVar110._0_4_ = (uint)(bVar52 & 1) * 0x7f800000 | (uint)!(bool)(bVar52 & 1) * (int)fVar211;
      bVar58 = (bool)(bVar52 >> 1 & 1);
      auVar110._4_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar216;
      bVar58 = (bool)(bVar52 >> 2 & 1);
      auVar110._8_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar217;
      bVar58 = (bool)(bVar52 >> 3 & 1);
      auVar110._12_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar218;
      bVar58 = (bool)(bVar52 >> 4 & 1);
      auVar110._16_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar219;
      bVar58 = (bool)(bVar52 >> 5 & 1);
      auVar110._20_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar237;
      bVar58 = (bool)(bVar52 >> 6 & 1);
      auVar110._24_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar242;
      auVar110._28_4_ =
           (uint)(bVar52 >> 7) * 0x7f800000 | (uint)!(bool)(bVar52 >> 7) * auVar92._28_4_;
      local_380 = vminps_avx(auVar104,auVar110);
      uVar12 = vcmpps_avx512vl(_local_760,local_380,2);
      bVar49 = bVar49 & 0x7f & (byte)uVar12;
      if (bVar49 == 0) goto LAB_01abf55b;
      auVar76 = vmaxps_avx512vl(auVar90,auVar75);
      auVar75 = vfmadd213ps_avx512vl(local_7e0,auVar98,auVar81);
      fVar211 = auVar79._0_4_;
      fVar216 = auVar79._4_4_;
      auVar33._4_4_ = fVar216 * auVar75._4_4_;
      auVar33._0_4_ = fVar211 * auVar75._0_4_;
      fVar217 = auVar79._8_4_;
      auVar33._8_4_ = fVar217 * auVar75._8_4_;
      fVar218 = auVar79._12_4_;
      auVar33._12_4_ = fVar218 * auVar75._12_4_;
      fVar219 = auVar79._16_4_;
      auVar33._16_4_ = fVar219 * auVar75._16_4_;
      fVar237 = auVar79._20_4_;
      auVar33._20_4_ = fVar237 * auVar75._20_4_;
      fVar242 = auVar79._24_4_;
      auVar33._24_4_ = fVar242 * auVar75._24_4_;
      auVar33._28_4_ = auVar75._28_4_;
      auVar75 = vfmadd213ps_avx512vl(local_5e0,auVar98,auVar81);
      auVar34._4_4_ = fVar216 * auVar75._4_4_;
      auVar34._0_4_ = fVar211 * auVar75._0_4_;
      auVar34._8_4_ = fVar217 * auVar75._8_4_;
      auVar34._12_4_ = fVar218 * auVar75._12_4_;
      auVar34._16_4_ = fVar219 * auVar75._16_4_;
      auVar34._20_4_ = fVar237 * auVar75._20_4_;
      auVar34._24_4_ = fVar242 * auVar75._24_4_;
      auVar34._28_4_ = auVar109._28_4_;
      auVar75 = vminps_avx512vl(auVar33,auVar95);
      auVar43 = ZEXT812(0);
      auVar82 = ZEXT1232(auVar43) << 0x20;
      auVar75 = vmaxps_avx(auVar75,ZEXT1232(auVar43) << 0x20);
      auVar92 = vminps_avx512vl(auVar34,auVar95);
      auVar35._4_4_ = (auVar75._4_4_ + 1.0) * 0.125;
      auVar35._0_4_ = (auVar75._0_4_ + 0.0) * 0.125;
      auVar35._8_4_ = (auVar75._8_4_ + 2.0) * 0.125;
      auVar35._12_4_ = (auVar75._12_4_ + 3.0) * 0.125;
      auVar35._16_4_ = (auVar75._16_4_ + 4.0) * 0.125;
      auVar35._20_4_ = (auVar75._20_4_ + 5.0) * 0.125;
      auVar35._24_4_ = (auVar75._24_4_ + 6.0) * 0.125;
      auVar35._28_4_ = auVar75._28_4_ + 7.0;
      auVar67 = vfmadd213ps_fma(auVar35,local_8c0,local_8a0);
      local_1e0 = ZEXT1632(auVar67);
      auVar75 = vmaxps_avx(auVar92,ZEXT1232(auVar43) << 0x20);
      auVar36._4_4_ = (auVar75._4_4_ + 1.0) * 0.125;
      auVar36._0_4_ = (auVar75._0_4_ + 0.0) * 0.125;
      auVar36._8_4_ = (auVar75._8_4_ + 2.0) * 0.125;
      auVar36._12_4_ = (auVar75._12_4_ + 3.0) * 0.125;
      auVar36._16_4_ = (auVar75._16_4_ + 4.0) * 0.125;
      auVar36._20_4_ = (auVar75._20_4_ + 5.0) * 0.125;
      auVar36._24_4_ = (auVar75._24_4_ + 6.0) * 0.125;
      auVar36._28_4_ = auVar75._28_4_ + 7.0;
      auVar67 = vfmadd213ps_fma(auVar36,local_8c0,local_8a0);
      local_200 = ZEXT1632(auVar67);
      auVar37._4_4_ = auVar76._4_4_ * auVar76._4_4_;
      auVar37._0_4_ = auVar76._0_4_ * auVar76._0_4_;
      auVar37._8_4_ = auVar76._8_4_ * auVar76._8_4_;
      auVar37._12_4_ = auVar76._12_4_ * auVar76._12_4_;
      auVar37._16_4_ = auVar76._16_4_ * auVar76._16_4_;
      auVar37._20_4_ = auVar76._20_4_ * auVar76._20_4_;
      auVar37._24_4_ = auVar76._24_4_ * auVar76._24_4_;
      auVar37._28_4_ = auVar76._28_4_;
      auVar75 = vsubps_avx(local_660,auVar37);
      auVar38._4_4_ = auVar75._4_4_ * (float)local_580._4_4_;
      auVar38._0_4_ = auVar75._0_4_ * (float)local_580._0_4_;
      auVar38._8_4_ = auVar75._8_4_ * fStack_578;
      auVar38._12_4_ = auVar75._12_4_ * fStack_574;
      auVar38._16_4_ = auVar75._16_4_ * fStack_570;
      auVar38._20_4_ = auVar75._20_4_ * fStack_56c;
      auVar38._24_4_ = auVar75._24_4_ * fStack_568;
      auVar38._28_4_ = auVar76._28_4_;
      auVar76 = vsubps_avx(local_7c0,auVar38);
      uVar59 = vcmpps_avx512vl(auVar76,ZEXT1232(auVar43) << 0x20,5);
      auVar264 = ZEXT3264(local_840);
      auVar265 = ZEXT3264(local_860);
      auVar266 = ZEXT3264(local_880);
      if ((byte)uVar59 == 0) {
        uVar59 = 0;
        auVar77 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar236 = ZEXT864(0) << 0x20;
        auVar76 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar92 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar245 = ZEXT864(0) << 0x20;
        auVar111._8_4_ = 0x7f800000;
        auVar111._0_8_ = 0x7f8000007f800000;
        auVar111._12_4_ = 0x7f800000;
        auVar111._16_4_ = 0x7f800000;
        auVar111._20_4_ = 0x7f800000;
        auVar111._24_4_ = 0x7f800000;
        auVar111._28_4_ = 0x7f800000;
        auVar112._8_4_ = 0xff800000;
        auVar112._0_8_ = 0xff800000ff800000;
        auVar112._12_4_ = 0xff800000;
        auVar112._16_4_ = 0xff800000;
        auVar112._20_4_ = 0xff800000;
        auVar112._24_4_ = 0xff800000;
        auVar112._28_4_ = 0xff800000;
      }
      else {
        auVar65 = vxorps_avx512vl(auVar89._0_16_,auVar89._0_16_);
        uVar60 = vcmpps_avx512vl(auVar76,auVar90,5);
        auVar76 = vsqrtps_avx(auVar76);
        auVar82 = vfnmadd213ps_avx512vl(auVar97,local_5a0,auVar95);
        auVar93 = vfmadd132ps_avx512vl(auVar82,local_5a0,local_5a0);
        auVar82 = vsubps_avx(local_5c0,auVar76);
        auVar94 = vmulps_avx512vl(auVar82,auVar93);
        auVar76 = vsubps_avx512vl(auVar76,auVar99);
        auVar93 = vmulps_avx512vl(auVar76,auVar93);
        auVar76 = vfmadd213ps_avx512vl(auVar98,auVar94,auVar81);
        auVar39._4_4_ = fVar216 * auVar76._4_4_;
        auVar39._0_4_ = fVar211 * auVar76._0_4_;
        auVar39._8_4_ = fVar217 * auVar76._8_4_;
        auVar39._12_4_ = fVar218 * auVar76._12_4_;
        auVar39._16_4_ = fVar219 * auVar76._16_4_;
        auVar39._20_4_ = fVar237 * auVar76._20_4_;
        auVar39._24_4_ = fVar242 * auVar76._24_4_;
        auVar39._28_4_ = auVar92._28_4_;
        auVar40._4_4_ = (float)local_440._4_4_ * auVar94._4_4_;
        auVar40._0_4_ = (float)local_440._0_4_ * auVar94._0_4_;
        auVar40._8_4_ = fStack_438 * auVar94._8_4_;
        auVar40._12_4_ = fStack_434 * auVar94._12_4_;
        auVar40._16_4_ = fStack_430 * auVar94._16_4_;
        auVar40._20_4_ = fStack_42c * auVar94._20_4_;
        auVar40._24_4_ = fStack_428 * auVar94._24_4_;
        auVar40._28_4_ = auVar76._28_4_;
        auVar82 = vmulps_avx512vl(local_460,auVar94);
        auVar86 = vmulps_avx512vl(local_480,auVar94);
        auVar76 = vfmadd213ps_avx512vl(auVar77,auVar39,auVar83);
        auVar76 = vsubps_avx512vl(auVar40,auVar76);
        auVar92 = vfmadd213ps_avx512vl(auVar78,auVar39,auVar84);
        auVar92 = vsubps_avx512vl(auVar82,auVar92);
        auVar67 = vfmadd213ps_fma(auVar39,auVar80,auVar85);
        auVar82 = vsubps_avx(auVar86,ZEXT1632(auVar67));
        auVar245 = ZEXT3264(auVar82);
        auVar81 = vfmadd213ps_avx512vl(auVar98,auVar93,auVar81);
        auVar79 = vmulps_avx512vl(auVar79,auVar81);
        auVar41._4_4_ = (float)local_440._4_4_ * auVar93._4_4_;
        auVar41._0_4_ = (float)local_440._0_4_ * auVar93._0_4_;
        auVar41._8_4_ = fStack_438 * auVar93._8_4_;
        auVar41._12_4_ = fStack_434 * auVar93._12_4_;
        auVar41._16_4_ = fStack_430 * auVar93._16_4_;
        auVar41._20_4_ = fStack_42c * auVar93._20_4_;
        auVar41._24_4_ = fStack_428 * auVar93._24_4_;
        auVar41._28_4_ = auVar86._28_4_;
        auVar81 = vmulps_avx512vl(local_460,auVar93);
        auVar86 = vmulps_avx512vl(local_480,auVar93);
        auVar67 = vfmadd213ps_fma(auVar77,auVar79,auVar83);
        auVar82 = vsubps_avx(auVar41,ZEXT1632(auVar67));
        auVar67 = vfmadd213ps_fma(auVar78,auVar79,auVar84);
        auVar77 = vsubps_avx512vl(auVar81,ZEXT1632(auVar67));
        auVar67 = vfmadd213ps_fma(auVar80,auVar79,auVar85);
        auVar78 = vsubps_avx512vl(auVar86,ZEXT1632(auVar67));
        auVar236 = ZEXT3264(auVar78);
        auVar141._8_4_ = 0x7f800000;
        auVar141._0_8_ = 0x7f8000007f800000;
        auVar141._12_4_ = 0x7f800000;
        auVar141._16_4_ = 0x7f800000;
        auVar141._20_4_ = 0x7f800000;
        auVar141._24_4_ = 0x7f800000;
        auVar141._28_4_ = 0x7f800000;
        auVar78 = vblendmps_avx512vl(auVar141,auVar94);
        bVar58 = (bool)((byte)uVar60 & 1);
        auVar111._0_4_ = (uint)bVar58 * auVar78._0_4_ | (uint)!bVar58 * 0x7f800000;
        bVar58 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar111._4_4_ = (uint)bVar58 * auVar78._4_4_ | (uint)!bVar58 * 0x7f800000;
        bVar58 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar111._8_4_ = (uint)bVar58 * auVar78._8_4_ | (uint)!bVar58 * 0x7f800000;
        bVar58 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar111._12_4_ = (uint)bVar58 * auVar78._12_4_ | (uint)!bVar58 * 0x7f800000;
        bVar58 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar111._16_4_ = (uint)bVar58 * auVar78._16_4_ | (uint)!bVar58 * 0x7f800000;
        bVar58 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar111._20_4_ = (uint)bVar58 * auVar78._20_4_ | (uint)!bVar58 * 0x7f800000;
        bVar58 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar111._24_4_ = (uint)bVar58 * auVar78._24_4_ | (uint)!bVar58 * 0x7f800000;
        bVar58 = SUB81(uVar60 >> 7,0);
        auVar111._28_4_ = (uint)bVar58 * auVar78._28_4_ | (uint)!bVar58 * 0x7f800000;
        auVar186._8_4_ = 0xff800000;
        auVar186._0_8_ = 0xff800000ff800000;
        auVar186._12_4_ = 0xff800000;
        auVar186._16_4_ = 0xff800000;
        auVar186._20_4_ = 0xff800000;
        auVar186._24_4_ = 0xff800000;
        auVar186._28_4_ = 0xff800000;
        auVar78 = vblendmps_avx512vl(auVar186,auVar93);
        bVar58 = (bool)((byte)uVar60 & 1);
        auVar112._0_4_ = (uint)bVar58 * auVar78._0_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar112._4_4_ = (uint)bVar58 * auVar78._4_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar112._8_4_ = (uint)bVar58 * auVar78._8_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar112._12_4_ = (uint)bVar58 * auVar78._12_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar112._16_4_ = (uint)bVar58 * auVar78._16_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar112._20_4_ = (uint)bVar58 * auVar78._20_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar112._24_4_ = (uint)bVar58 * auVar78._24_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = SUB81(uVar60 >> 7,0);
        auVar112._28_4_ = (uint)bVar58 * auVar78._28_4_ | (uint)!bVar58 * -0x800000;
        auVar27._8_4_ = 0x36000000;
        auVar27._0_8_ = 0x3600000036000000;
        auVar27._12_4_ = 0x36000000;
        auVar27._16_4_ = 0x36000000;
        auVar27._20_4_ = 0x36000000;
        auVar27._24_4_ = 0x36000000;
        auVar27._28_4_ = 0x36000000;
        auVar78 = vmulps_avx512vl(local_720,auVar27);
        uVar55 = vcmpps_avx512vl(auVar78,local_740,0xe);
        uVar60 = uVar60 & uVar55;
        bVar52 = (byte)uVar60;
        if (bVar52 != 0) {
          uVar55 = vcmpps_avx512vl(auVar75,ZEXT1632(auVar65),2);
          auVar235._8_4_ = 0x7f800000;
          auVar235._0_8_ = 0x7f8000007f800000;
          auVar235._12_4_ = 0x7f800000;
          auVar235._16_4_ = 0x7f800000;
          auVar235._20_4_ = 0x7f800000;
          auVar235._24_4_ = 0x7f800000;
          auVar235._28_4_ = 0x7f800000;
          auVar251._8_4_ = 0xff800000;
          auVar251._0_8_ = 0xff800000ff800000;
          auVar251._12_4_ = 0xff800000;
          auVar251._16_4_ = 0xff800000;
          auVar251._20_4_ = 0xff800000;
          auVar251._24_4_ = 0xff800000;
          auVar251._28_4_ = 0xff800000;
          auVar75 = vblendmps_avx512vl(auVar235,auVar251);
          bVar51 = (byte)uVar55;
          uVar61 = (uint)(bVar51 & 1) * auVar75._0_4_ | (uint)!(bool)(bVar51 & 1) * auVar78._0_4_;
          bVar58 = (bool)((byte)(uVar55 >> 1) & 1);
          uVar122 = (uint)bVar58 * auVar75._4_4_ | (uint)!bVar58 * auVar78._4_4_;
          bVar58 = (bool)((byte)(uVar55 >> 2) & 1);
          uVar123 = (uint)bVar58 * auVar75._8_4_ | (uint)!bVar58 * auVar78._8_4_;
          bVar58 = (bool)((byte)(uVar55 >> 3) & 1);
          uVar124 = (uint)bVar58 * auVar75._12_4_ | (uint)!bVar58 * auVar78._12_4_;
          bVar58 = (bool)((byte)(uVar55 >> 4) & 1);
          uVar125 = (uint)bVar58 * auVar75._16_4_ | (uint)!bVar58 * auVar78._16_4_;
          bVar58 = (bool)((byte)(uVar55 >> 5) & 1);
          uVar126 = (uint)bVar58 * auVar75._20_4_ | (uint)!bVar58 * auVar78._20_4_;
          bVar58 = (bool)((byte)(uVar55 >> 6) & 1);
          uVar127 = (uint)bVar58 * auVar75._24_4_ | (uint)!bVar58 * auVar78._24_4_;
          bVar58 = SUB81(uVar55 >> 7,0);
          uVar128 = (uint)bVar58 * auVar75._28_4_ | (uint)!bVar58 * auVar78._28_4_;
          auVar111._0_4_ = (bVar52 & 1) * uVar61 | !(bool)(bVar52 & 1) * auVar111._0_4_;
          bVar58 = (bool)((byte)(uVar60 >> 1) & 1);
          auVar111._4_4_ = bVar58 * uVar122 | !bVar58 * auVar111._4_4_;
          bVar58 = (bool)((byte)(uVar60 >> 2) & 1);
          auVar111._8_4_ = bVar58 * uVar123 | !bVar58 * auVar111._8_4_;
          bVar58 = (bool)((byte)(uVar60 >> 3) & 1);
          auVar111._12_4_ = bVar58 * uVar124 | !bVar58 * auVar111._12_4_;
          bVar58 = (bool)((byte)(uVar60 >> 4) & 1);
          auVar111._16_4_ = bVar58 * uVar125 | !bVar58 * auVar111._16_4_;
          bVar58 = (bool)((byte)(uVar60 >> 5) & 1);
          auVar111._20_4_ = bVar58 * uVar126 | !bVar58 * auVar111._20_4_;
          bVar58 = (bool)((byte)(uVar60 >> 6) & 1);
          auVar111._24_4_ = bVar58 * uVar127 | !bVar58 * auVar111._24_4_;
          bVar58 = SUB81(uVar60 >> 7,0);
          auVar111._28_4_ = bVar58 * uVar128 | !bVar58 * auVar111._28_4_;
          auVar75 = vblendmps_avx512vl(auVar251,auVar235);
          bVar58 = (bool)((byte)(uVar55 >> 1) & 1);
          bVar5 = (bool)((byte)(uVar55 >> 2) & 1);
          bVar6 = (bool)((byte)(uVar55 >> 3) & 1);
          bVar7 = (bool)((byte)(uVar55 >> 4) & 1);
          bVar8 = (bool)((byte)(uVar55 >> 5) & 1);
          bVar9 = (bool)((byte)(uVar55 >> 6) & 1);
          bVar10 = SUB81(uVar55 >> 7,0);
          auVar112._0_4_ =
               (uint)(bVar52 & 1) *
               ((uint)(bVar51 & 1) * auVar75._0_4_ | !(bool)(bVar51 & 1) * uVar61) |
               !(bool)(bVar52 & 1) * auVar112._0_4_;
          bVar4 = (bool)((byte)(uVar60 >> 1) & 1);
          auVar112._4_4_ =
               (uint)bVar4 * ((uint)bVar58 * auVar75._4_4_ | !bVar58 * uVar122) |
               !bVar4 * auVar112._4_4_;
          bVar58 = (bool)((byte)(uVar60 >> 2) & 1);
          auVar112._8_4_ =
               (uint)bVar58 * ((uint)bVar5 * auVar75._8_4_ | !bVar5 * uVar123) |
               !bVar58 * auVar112._8_4_;
          bVar58 = (bool)((byte)(uVar60 >> 3) & 1);
          auVar112._12_4_ =
               (uint)bVar58 * ((uint)bVar6 * auVar75._12_4_ | !bVar6 * uVar124) |
               !bVar58 * auVar112._12_4_;
          bVar58 = (bool)((byte)(uVar60 >> 4) & 1);
          auVar112._16_4_ =
               (uint)bVar58 * ((uint)bVar7 * auVar75._16_4_ | !bVar7 * uVar125) |
               !bVar58 * auVar112._16_4_;
          bVar58 = (bool)((byte)(uVar60 >> 5) & 1);
          auVar112._20_4_ =
               (uint)bVar58 * ((uint)bVar8 * auVar75._20_4_ | !bVar8 * uVar126) |
               !bVar58 * auVar112._20_4_;
          bVar58 = (bool)((byte)(uVar60 >> 6) & 1);
          auVar112._24_4_ =
               (uint)bVar58 * ((uint)bVar9 * auVar75._24_4_ | !bVar9 * uVar127) |
               !bVar58 * auVar112._24_4_;
          bVar58 = SUB81(uVar60 >> 7,0);
          auVar112._28_4_ =
               (uint)bVar58 * ((uint)bVar10 * auVar75._28_4_ | !bVar10 * uVar128) |
               !bVar58 * auVar112._28_4_;
          uVar59 = (ulong)(byte)((~bVar52 | bVar51) & (byte)uVar59);
        }
      }
      auVar257 = ZEXT3264(local_8e0);
      auVar258 = ZEXT3264(local_900);
      auVar260 = ZEXT3264(local_920);
      auVar262 = ZEXT3264(local_940);
      auVar263 = ZEXT3264(local_960);
      auVar247._0_4_ = local_480._0_4_ * auVar236._0_4_;
      auVar247._4_4_ = local_480._4_4_ * auVar236._4_4_;
      auVar247._8_4_ = local_480._8_4_ * auVar236._8_4_;
      auVar247._12_4_ = local_480._12_4_ * auVar236._12_4_;
      auVar247._16_4_ = local_480._16_4_ * auVar236._16_4_;
      auVar247._20_4_ = local_480._20_4_ * auVar236._20_4_;
      auVar247._28_36_ = auVar236._28_36_;
      auVar247._24_4_ = local_480._24_4_ * auVar236._24_4_;
      auVar241 = ZEXT3264(local_460);
      auVar67 = vfmadd231ps_fma(auVar247._0_32_,local_460,auVar77);
      auVar236 = ZEXT3264(_local_440);
      auVar67 = vfmadd231ps_fma(ZEXT1632(auVar67),_local_440,auVar82);
      auVar230._8_4_ = 0x7fffffff;
      auVar230._0_8_ = 0x7fffffff7fffffff;
      auVar230._12_4_ = 0x7fffffff;
      auVar230._16_4_ = 0x7fffffff;
      auVar230._20_4_ = 0x7fffffff;
      auVar230._24_4_ = 0x7fffffff;
      auVar230._28_4_ = 0x7fffffff;
      auVar75 = vandps_avx(ZEXT1632(auVar67),auVar230);
      auVar247 = ZEXT3264(_local_760);
      _local_1c0 = _local_760;
      auVar224._8_4_ = 0x3e99999a;
      auVar224._0_8_ = 0x3e99999a3e99999a;
      auVar224._12_4_ = 0x3e99999a;
      auVar224._16_4_ = 0x3e99999a;
      auVar224._20_4_ = 0x3e99999a;
      auVar224._24_4_ = 0x3e99999a;
      auVar224._28_4_ = 0x3e99999a;
      uVar12 = vcmpps_avx512vl(auVar75,auVar224,1);
      local_420._0_2_ = (short)uVar12;
      local_3a0 = vmaxps_avx(_local_760,auVar112);
      auVar75 = vminps_avx(local_380,auVar111);
      uVar12 = vcmpps_avx512vl(_local_760,auVar75,2);
      bVar52 = (byte)uVar12 & bVar49;
      uVar13 = vcmpps_avx512vl(local_3a0,local_380,2);
      auVar259 = ZEXT3264(local_800);
      auVar261 = ZEXT3264(local_820);
      if ((bVar49 & ((byte)uVar13 | (byte)uVar12)) != 0) {
        auVar42._4_4_ = local_480._4_4_ * auVar245._4_4_;
        auVar42._0_4_ = local_480._0_4_ * auVar245._0_4_;
        auVar42._8_4_ = local_480._8_4_ * auVar245._8_4_;
        auVar42._12_4_ = local_480._12_4_ * auVar245._12_4_;
        auVar42._16_4_ = local_480._16_4_ * auVar245._16_4_;
        auVar42._20_4_ = local_480._20_4_ * auVar245._20_4_;
        auVar42._24_4_ = local_480._24_4_ * auVar245._24_4_;
        auVar42._28_4_ = auVar75._28_4_;
        auVar67 = vfmadd213ps_fma(auVar92,local_460,auVar42);
        auVar67 = vfmadd213ps_fma(auVar76,_local_440,ZEXT1632(auVar67));
        auVar75 = vandps_avx(ZEXT1632(auVar67),auVar230);
        uVar12 = vcmpps_avx512vl(auVar75,auVar224,1);
        local_990 = (undefined4)CONCAT71((int7)(uVar59 >> 8),~(byte)uVar59);
        bVar51 = (byte)uVar12 | ~(byte)uVar59;
        auVar143._8_4_ = 2;
        auVar143._0_8_ = 0x200000002;
        auVar143._12_4_ = 2;
        auVar143._16_4_ = 2;
        auVar143._20_4_ = 2;
        auVar143._24_4_ = 2;
        auVar143._28_4_ = 2;
        auVar28._8_4_ = 3;
        auVar28._0_8_ = 0x300000003;
        auVar28._12_4_ = 3;
        auVar28._16_4_ = 3;
        auVar28._20_4_ = 3;
        auVar28._24_4_ = 3;
        auVar28._28_4_ = 3;
        auVar75 = vpblendmd_avx512vl(auVar143,auVar28);
        local_340._0_4_ = (uint)(bVar51 & 1) * auVar75._0_4_ | (uint)!(bool)(bVar51 & 1) * 2;
        bVar58 = (bool)(bVar51 >> 1 & 1);
        local_340._4_4_ = (uint)bVar58 * auVar75._4_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar51 >> 2 & 1);
        local_340._8_4_ = (uint)bVar58 * auVar75._8_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar51 >> 3 & 1);
        local_340._12_4_ = (uint)bVar58 * auVar75._12_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar51 >> 4 & 1);
        local_340._16_4_ = (uint)bVar58 * auVar75._16_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar51 >> 5 & 1);
        local_340._20_4_ = (uint)bVar58 * auVar75._20_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar51 >> 6 & 1);
        local_340._24_4_ = (uint)bVar58 * auVar75._24_4_ | (uint)!bVar58 * 2;
        local_340._28_4_ = (uint)(bVar51 >> 7) * auVar75._28_4_ | (uint)!(bool)(bVar51 >> 7) * 2;
        local_3c0 = vpbroadcastd_avx512vl();
        uVar12 = vpcmpd_avx512vl(local_3c0,local_340,5);
        local_98c = (uint)bVar52;
        bVar52 = (byte)uVar12 & bVar52;
        if (bVar52 == 0) {
          auVar145._4_4_ = uVar62;
          auVar145._0_4_ = uVar62;
          auVar145._8_4_ = uVar62;
          auVar145._12_4_ = uVar62;
          auVar145._16_4_ = uVar62;
          auVar145._20_4_ = uVar62;
          auVar145._24_4_ = uVar62;
          auVar145._28_4_ = uVar62;
          auVar75 = local_3a0;
        }
        else {
          local_360 = local_3a0;
          auVar65 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar67 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar68 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar70 = vminps_avx(auVar65,auVar68);
          auVar65 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar68 = vmaxps_avx(auVar67,auVar65);
          auVar168._8_4_ = 0x7fffffff;
          auVar168._0_8_ = 0x7fffffff7fffffff;
          auVar168._12_4_ = 0x7fffffff;
          auVar67 = vandps_avx(auVar70,auVar168);
          auVar65 = vandps_avx(auVar68,auVar168);
          auVar67 = vmaxps_avx(auVar67,auVar65);
          auVar65 = vmovshdup_avx(auVar67);
          auVar65 = vmaxss_avx(auVar65,auVar67);
          auVar67 = vshufpd_avx(auVar67,auVar67,1);
          auVar67 = vmaxss_avx(auVar67,auVar65);
          fVar211 = auVar67._0_4_ * 1.9073486e-06;
          local_620 = vshufps_avx(auVar68,auVar68,0xff);
          local_400 = (float)local_760._0_4_ + (float)local_980._0_4_;
          fStack_3fc = (float)local_760._4_4_ + (float)local_980._4_4_;
          fStack_3f8 = fStack_758 + fStack_978;
          fStack_3f4 = fStack_754 + fStack_974;
          fStack_3f0 = fStack_750 + fStack_970;
          fStack_3ec = fStack_74c + fStack_96c;
          fStack_3e8 = fStack_748 + fStack_968;
          fStack_3e4 = fStack_744 + fStack_964;
          do {
            auVar144._8_4_ = 0x7f800000;
            auVar144._0_8_ = 0x7f8000007f800000;
            auVar144._12_4_ = 0x7f800000;
            auVar144._16_4_ = 0x7f800000;
            auVar144._20_4_ = 0x7f800000;
            auVar144._24_4_ = 0x7f800000;
            auVar144._28_4_ = 0x7f800000;
            auVar75 = vblendmps_avx512vl(auVar144,_local_760);
            auVar114._0_4_ =
                 (uint)(bVar52 & 1) * auVar75._0_4_ | (uint)!(bool)(bVar52 & 1) * 0x7f800000;
            bVar58 = (bool)(bVar52 >> 1 & 1);
            auVar114._4_4_ = (uint)bVar58 * auVar75._4_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar52 >> 2 & 1);
            auVar114._8_4_ = (uint)bVar58 * auVar75._8_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar52 >> 3 & 1);
            auVar114._12_4_ = (uint)bVar58 * auVar75._12_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar52 >> 4 & 1);
            auVar114._16_4_ = (uint)bVar58 * auVar75._16_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar52 >> 5 & 1);
            auVar114._20_4_ = (uint)bVar58 * auVar75._20_4_ | (uint)!bVar58 * 0x7f800000;
            auVar114._24_4_ =
                 (uint)(bVar52 >> 6) * auVar75._24_4_ | (uint)!(bool)(bVar52 >> 6) * 0x7f800000;
            auVar114._28_4_ = 0x7f800000;
            auVar75 = vshufps_avx(auVar114,auVar114,0xb1);
            auVar75 = vminps_avx(auVar114,auVar75);
            auVar76 = vshufpd_avx(auVar75,auVar75,5);
            auVar75 = vminps_avx(auVar75,auVar76);
            auVar76 = vpermpd_avx2(auVar75,0x4e);
            auVar75 = vminps_avx(auVar75,auVar76);
            uVar12 = vcmpps_avx512vl(auVar114,auVar75,0);
            bVar50 = (byte)uVar12 & bVar52;
            bVar51 = bVar52;
            if (bVar50 != 0) {
              bVar51 = bVar50;
            }
            iVar15 = 0;
            for (uVar62 = (uint)bVar51; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
              iVar15 = iVar15 + 1;
            }
            fVar216 = local_988;
            auVar67 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar15 << 2)));
            auVar65 = ZEXT416(*(uint *)(local_1e0 + (uint)(iVar15 << 2)));
            if ((float)local_700._0_4_ < 0.0) {
              local_8a0._0_16_ = ZEXT416(*(uint *)(local_1e0 + (uint)(iVar15 << 2)));
              local_8c0._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar15 << 2)));
              fVar216 = sqrtf((float)local_700._0_4_);
              auVar67 = local_8c0._0_16_;
              auVar65 = local_8a0._0_16_;
            }
            auVar67 = vinsertps_avx(auVar67,auVar65,0x10);
            bVar58 = true;
            uVar59 = 0;
            do {
              uVar148 = auVar67._0_4_;
              auVar133._4_4_ = uVar148;
              auVar133._0_4_ = uVar148;
              auVar133._8_4_ = uVar148;
              auVar133._12_4_ = uVar148;
              auVar65 = vfmadd132ps_fma(auVar133,ZEXT816(0) << 0x40,local_6f0);
              auVar68 = vmovshdup_avx(auVar67);
              fVar209 = auVar68._0_4_;
              fVar208 = 1.0 - fVar209;
              fVar129 = fVar209 * fVar209;
              auVar238 = SUB6416(ZEXT464(0x40400000),0);
              auVar72 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar71 = vfmadd213ss_fma(auVar238,auVar68,auVar72);
              auVar70 = vfmadd213ss_fma(auVar71,ZEXT416((uint)fVar129),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar69 = vfmadd213ss_fma(auVar238,ZEXT416((uint)fVar208),auVar72);
              auVar69 = vfmadd213ss_fma(auVar69,ZEXT416((uint)(fVar208 * fVar208)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar190 = fVar208 * fVar208 * -fVar209 * 0.5;
              fVar205 = auVar70._0_4_ * 0.5;
              fVar206 = auVar69._0_4_ * 0.5;
              fVar207 = fVar209 * fVar209 * -fVar208 * 0.5;
              auVar193._0_4_ = fVar207 * (float)local_6e0._0_4_;
              auVar193._4_4_ = fVar207 * (float)local_6e0._4_4_;
              auVar193._8_4_ = fVar207 * fStack_6d8;
              auVar193._12_4_ = fVar207 * fStack_6d4;
              auVar214._4_4_ = fVar206;
              auVar214._0_4_ = fVar206;
              auVar214._8_4_ = fVar206;
              auVar214._12_4_ = fVar206;
              auVar70 = vfmadd132ps_fma(auVar214,auVar193,local_6a0._0_16_);
              auVar169._4_4_ = fVar205;
              auVar169._0_4_ = fVar205;
              auVar169._8_4_ = fVar205;
              auVar169._12_4_ = fVar205;
              auVar70 = vfmadd132ps_fma(auVar169,auVar70,local_6c0._0_16_);
              auVar194._4_4_ = fVar190;
              auVar194._0_4_ = fVar190;
              auVar194._8_4_ = fVar190;
              auVar194._12_4_ = fVar190;
              auVar70 = vfmadd132ps_fma(auVar194,auVar70,local_680._0_16_);
              auVar69 = vfmadd231ss_fma(auVar72,auVar68,ZEXT416(0x41100000));
              local_5a0._0_16_ = auVar69;
              auVar69 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar68,ZEXT416(0x40800000));
              local_5c0._0_16_ = auVar69;
              auVar69 = vfmadd213ss_fma(auVar238,auVar68,ZEXT416(0xbf800000));
              local_5e0._0_16_ = auVar69;
              _local_580 = auVar70;
              auVar65 = vsubps_avx(auVar65,auVar70);
              local_8a0._0_16_ = auVar65;
              auVar65 = vdpps_avx(auVar65,auVar65,0x7f);
              local_8c0._0_16_ = auVar65;
              local_660._0_16_ = auVar67;
              if (auVar65._0_4_ < 0.0) {
                local_7c0._0_4_ = auVar71._0_4_;
                local_7e0._0_16_ = ZEXT416((uint)fVar208);
                local_720._0_4_ = fVar129;
                local_740._0_4_ = fVar208 * -2.0;
                auVar241._0_4_ = sqrtf(auVar65._0_4_);
                auVar241._4_60_ = extraout_var;
                auVar71 = ZEXT416((uint)local_7c0._0_4_);
                auVar67 = auVar241._0_16_;
                auVar65 = local_7e0._0_16_;
              }
              else {
                auVar67 = vsqrtss_avx(auVar65,auVar65);
                local_740._0_4_ = fVar208 * -2.0;
                local_720._0_4_ = fVar129;
                auVar65 = ZEXT416((uint)fVar208);
              }
              fVar129 = auVar65._0_4_;
              auVar69 = vfnmadd231ss_fma(ZEXT416((uint)(fVar209 * (fVar129 + fVar129))),auVar65,
                                         auVar65);
              auVar65 = vfmadd213ss_fma(auVar71,ZEXT416((uint)(fVar209 + fVar209)),
                                        ZEXT416((uint)(fVar209 * fVar209 * 3.0)));
              auVar70 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar68,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar71 = vfmadd231ss_fma(ZEXT416((uint)(fVar129 * fVar129 * -3.0)),
                                        ZEXT416((uint)(fVar129 + fVar129)),auVar70);
              auVar70 = vfmadd213ss_fma(ZEXT416((uint)local_740._0_4_),auVar68,
                                        ZEXT416((uint)local_720._0_4_));
              fVar129 = auVar69._0_4_ * 0.5;
              fVar190 = auVar65._0_4_ * 0.5;
              fVar205 = auVar71._0_4_ * 0.5;
              fVar206 = auVar70._0_4_ * 0.5;
              auVar195._0_4_ = fVar206 * (float)local_6e0._0_4_;
              auVar195._4_4_ = fVar206 * (float)local_6e0._4_4_;
              auVar195._8_4_ = fVar206 * fStack_6d8;
              auVar195._12_4_ = fVar206 * fStack_6d4;
              auVar170._4_4_ = fVar205;
              auVar170._0_4_ = fVar205;
              auVar170._8_4_ = fVar205;
              auVar170._12_4_ = fVar205;
              auVar65 = vfmadd132ps_fma(auVar170,auVar195,local_6a0._0_16_);
              auVar152._4_4_ = fVar190;
              auVar152._0_4_ = fVar190;
              auVar152._8_4_ = fVar190;
              auVar152._12_4_ = fVar190;
              auVar65 = vfmadd132ps_fma(auVar152,auVar65,local_6c0._0_16_);
              auVar249._4_4_ = fVar129;
              auVar249._0_4_ = fVar129;
              auVar249._8_4_ = fVar129;
              auVar249._12_4_ = fVar129;
              local_7c0._0_16_ = vfmadd132ps_fma(auVar249,auVar65,local_680._0_16_);
              local_720._0_16_ = vdpps_avx(local_7c0._0_16_,local_7c0._0_16_,0x7f);
              auVar44._12_4_ = 0;
              auVar44._0_12_ = ZEXT812(0);
              fVar129 = local_720._0_4_;
              auVar65 = vrsqrt14ss_avx512f(auVar44 << 0x20,ZEXT416((uint)fVar129));
              fVar190 = auVar65._0_4_;
              local_740._0_16_ = vrcp14ss_avx512f(auVar44 << 0x20,ZEXT416((uint)fVar129));
              auVar17._8_4_ = 0x80000000;
              auVar17._0_8_ = 0x8000000080000000;
              auVar17._12_4_ = 0x80000000;
              auVar70 = vxorps_avx512vl(local_720._0_16_,auVar17);
              auVar65 = vfnmadd213ss_fma(local_740._0_16_,local_720._0_16_,
                                         SUB6416(ZEXT464(0x40000000),0));
              local_7a0._0_4_ = auVar65._0_4_;
              local_7e0._0_4_ = auVar67._0_4_;
              if (fVar129 < auVar70._0_4_) {
                fVar205 = sqrtf(fVar129);
                auVar67 = ZEXT416((uint)local_7e0._0_4_);
                auVar65 = local_7c0._0_16_;
              }
              else {
                auVar65 = vsqrtss_avx(local_720._0_16_,local_720._0_16_);
                fVar205 = auVar65._0_4_;
                auVar65 = local_7c0._0_16_;
              }
              fVar129 = fVar190 * 1.5 + fVar129 * -0.5 * fVar190 * fVar190 * fVar190;
              auVar134._0_4_ = auVar65._0_4_ * fVar129;
              auVar134._4_4_ = auVar65._4_4_ * fVar129;
              auVar134._8_4_ = auVar65._8_4_ * fVar129;
              auVar134._12_4_ = auVar65._12_4_ * fVar129;
              auVar70 = vdpps_avx(local_8a0._0_16_,auVar134,0x7f);
              fVar207 = auVar67._0_4_;
              fVar190 = auVar70._0_4_;
              auVar135._0_4_ = fVar190 * fVar190;
              auVar135._4_4_ = auVar70._4_4_ * auVar70._4_4_;
              auVar135._8_4_ = auVar70._8_4_ * auVar70._8_4_;
              auVar135._12_4_ = auVar70._12_4_ * auVar70._12_4_;
              auVar71 = vsubps_avx512vl(local_8c0._0_16_,auVar135);
              fVar206 = auVar71._0_4_;
              auVar153._4_12_ = ZEXT812(0) << 0x20;
              auVar153._0_4_ = fVar206;
              auVar69 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar153);
              auVar72 = vmulss_avx512f(auVar71,ZEXT416(0xbf000000));
              if (fVar206 < 0.0) {
                local_610 = fVar129;
                fStack_60c = fVar129;
                fStack_608 = fVar129;
                fStack_604 = fVar129;
                local_600 = auVar69;
                fVar217 = sqrtf(fVar206);
                auVar72 = ZEXT416(auVar72._0_4_);
                auVar67 = ZEXT416((uint)local_7e0._0_4_);
                auVar71 = local_600;
                auVar65 = local_7c0._0_16_;
                fVar129 = local_610;
                fVar206 = fStack_60c;
                fVar208 = fStack_608;
                fVar209 = fStack_604;
              }
              else {
                auVar71 = vsqrtss_avx(auVar71,auVar71);
                fVar217 = auVar71._0_4_;
                auVar71 = auVar69;
                fVar206 = fVar129;
                fVar208 = fVar129;
                fVar209 = fVar129;
              }
              auVar245 = ZEXT1664(local_8a0._0_16_);
              auVar257 = ZEXT3264(local_8e0);
              auVar258 = ZEXT3264(local_900);
              auVar259 = ZEXT3264(local_800);
              auVar260 = ZEXT3264(local_920);
              auVar261 = ZEXT3264(local_820);
              auVar262 = ZEXT3264(local_940);
              auVar263 = ZEXT3264(local_960);
              auVar264 = ZEXT3264(local_840);
              auVar265 = ZEXT3264(local_860);
              auVar266 = ZEXT3264(local_880);
              auVar154._0_4_ = (float)local_5e0._0_4_ * (float)local_6e0._0_4_;
              auVar154._4_4_ = (float)local_5e0._0_4_ * (float)local_6e0._4_4_;
              auVar154._8_4_ = (float)local_5e0._0_4_ * fStack_6d8;
              auVar154._12_4_ = (float)local_5e0._0_4_ * fStack_6d4;
              auVar171._4_4_ = local_5c0._0_4_;
              auVar171._0_4_ = local_5c0._0_4_;
              auVar171._8_4_ = local_5c0._0_4_;
              auVar171._12_4_ = local_5c0._0_4_;
              auVar238 = vfmadd132ps_fma(auVar171,auVar154,local_6a0._0_16_);
              auVar155._4_4_ = local_5a0._0_4_;
              auVar155._0_4_ = local_5a0._0_4_;
              auVar155._8_4_ = local_5a0._0_4_;
              auVar155._12_4_ = local_5a0._0_4_;
              auVar238 = vfmadd132ps_fma(auVar155,auVar238,local_6c0._0_16_);
              auVar68 = vfmadd213ss_fma(auVar68,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
              uVar148 = auVar68._0_4_;
              auVar172._4_4_ = uVar148;
              auVar172._0_4_ = uVar148;
              auVar172._8_4_ = uVar148;
              auVar172._12_4_ = uVar148;
              auVar68 = vfmadd132ps_fma(auVar172,auVar238,local_680._0_16_);
              auVar156._0_4_ = auVar68._0_4_ * (float)local_720._0_4_;
              auVar156._4_4_ = auVar68._4_4_ * (float)local_720._0_4_;
              auVar156._8_4_ = auVar68._8_4_ * (float)local_720._0_4_;
              auVar156._12_4_ = auVar68._12_4_ * (float)local_720._0_4_;
              auVar68 = vdpps_avx(auVar65,auVar68,0x7f);
              fVar210 = auVar68._0_4_;
              auVar173._0_4_ = auVar65._0_4_ * fVar210;
              auVar173._4_4_ = auVar65._4_4_ * fVar210;
              auVar173._8_4_ = auVar65._8_4_ * fVar210;
              auVar173._12_4_ = auVar65._12_4_ * fVar210;
              auVar68 = vsubps_avx(auVar156,auVar173);
              fVar210 = (float)local_7a0._0_4_ * (float)local_740._0_4_;
              auVar238 = vmaxss_avx(ZEXT416((uint)fVar211),
                                    ZEXT416((uint)(local_660._0_4_ * fVar216 * 1.9073486e-06)));
              auVar18._8_4_ = 0x80000000;
              auVar18._0_8_ = 0x8000000080000000;
              auVar18._12_4_ = 0x80000000;
              auVar116._16_16_ = local_880._16_16_;
              auVar73 = vxorps_avx512vl(auVar65,auVar18);
              auVar174._0_4_ = fVar129 * auVar68._0_4_ * fVar210;
              auVar174._4_4_ = fVar206 * auVar68._4_4_ * fVar210;
              auVar174._8_4_ = fVar208 * auVar68._8_4_ * fVar210;
              auVar174._12_4_ = fVar209 * auVar68._12_4_ * fVar210;
              auVar247 = ZEXT1664(auVar134);
              auVar68 = vdpps_avx(auVar73,auVar134,0x7f);
              auVar11 = vfmadd213ss_fma(auVar67,ZEXT416((uint)fVar211),auVar238);
              auVar67 = vdpps_avx(local_8a0._0_16_,auVar174,0x7f);
              auVar11 = vfmadd213ss_fma(ZEXT416((uint)(fVar207 + 1.0)),
                                        ZEXT416((uint)(fVar211 / fVar205)),auVar11);
              fVar129 = auVar68._0_4_ + auVar67._0_4_;
              auVar67 = vdpps_avx(local_6f0,auVar134,0x7f);
              auVar68 = vdpps_avx(local_8a0._0_16_,auVar73,0x7f);
              auVar72 = vmulss_avx512f(auVar72,auVar71);
              fVar205 = auVar69._0_4_ * 1.5 + auVar72._0_4_ * auVar71._0_4_ * auVar71._0_4_;
              auVar71 = vdpps_avx(local_8a0._0_16_,local_6f0,0x7f);
              auVar72 = vfnmadd231ss_fma(auVar68,auVar70,ZEXT416((uint)fVar129));
              auVar71 = vfnmadd231ss_fma(auVar71,auVar70,auVar67);
              auVar68 = vpermilps_avx(_local_580,0xff);
              fVar217 = fVar217 - auVar68._0_4_;
              auVar69 = vshufps_avx(auVar65,auVar65,0xff);
              auVar68 = vfmsub213ss_fma(auVar72,ZEXT416((uint)fVar205),auVar69);
              auVar239._8_4_ = 0x80000000;
              auVar239._0_8_ = 0x8000000080000000;
              auVar239._12_4_ = 0x80000000;
              auVar241 = ZEXT1664(auVar239);
              auVar233._0_8_ = auVar68._0_8_ ^ 0x8000000080000000;
              auVar233._8_4_ = auVar68._8_4_ ^ 0x80000000;
              auVar233._12_4_ = auVar68._12_4_ ^ 0x80000000;
              auVar236 = ZEXT1664(auVar233);
              auVar71 = ZEXT416((uint)(auVar71._0_4_ * fVar205));
              auVar72 = vfmsub231ss_fma(ZEXT416((uint)(auVar67._0_4_ * auVar68._0_4_)),
                                        ZEXT416((uint)fVar129),auVar71);
              auVar68 = vinsertps_avx(auVar233,auVar71,0x1c);
              auVar222._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
              auVar222._8_4_ = auVar67._8_4_ ^ 0x80000000;
              auVar222._12_4_ = auVar67._12_4_ ^ 0x80000000;
              auVar71 = vinsertps_avx(ZEXT416((uint)fVar129),auVar222,0x10);
              auVar196._0_4_ = auVar72._0_4_;
              auVar196._4_4_ = auVar196._0_4_;
              auVar196._8_4_ = auVar196._0_4_;
              auVar196._12_4_ = auVar196._0_4_;
              auVar67 = vdivps_avx(auVar68,auVar196);
              auVar68 = vdivps_avx(auVar71,auVar196);
              auVar197._0_4_ = fVar190 * auVar67._0_4_ + fVar217 * auVar68._0_4_;
              auVar197._4_4_ = fVar190 * auVar67._4_4_ + fVar217 * auVar68._4_4_;
              auVar197._8_4_ = fVar190 * auVar67._8_4_ + fVar217 * auVar68._8_4_;
              auVar197._12_4_ = fVar190 * auVar67._12_4_ + fVar217 * auVar68._12_4_;
              auVar67 = vsubps_avx(local_660._0_16_,auVar197);
              auVar19._8_4_ = 0x7fffffff;
              auVar19._0_8_ = 0x7fffffff7fffffff;
              auVar19._12_4_ = 0x7fffffff;
              auVar68 = vandps_avx512vl(auVar70,auVar19);
              fVar129 = (float)local_980._0_4_;
              fVar190 = (float)local_980._4_4_;
              fVar205 = fStack_978;
              fVar206 = fStack_974;
              fVar207 = fStack_970;
              fVar208 = fStack_96c;
              fVar209 = fStack_968;
              fVar210 = fStack_964;
              if (auVar68._0_4_ < auVar11._0_4_) {
                auVar68 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ + auVar238._0_4_)),local_620,
                                          ZEXT416(0x36000000));
                auVar20._8_4_ = 0x7fffffff;
                auVar20._0_8_ = 0x7fffffff7fffffff;
                auVar20._12_4_ = 0x7fffffff;
                auVar70 = vandps_avx512vl(ZEXT416((uint)fVar217),auVar20);
                if (auVar70._0_4_ < auVar68._0_4_) {
                  fVar216 = auVar67._0_4_ + (float)local_630._0_4_;
                  if (fVar216 < fVar147) {
LAB_01ac007e:
                    bVar51 = 0;
                    goto LAB_01ac00a6;
                  }
                  fVar217 = *(float *)(ray + k * 4 + 0x80);
                  if (fVar216 <= fVar217) {
                    auVar68 = vmovshdup_avx(auVar67);
                    bVar51 = 0;
                    if ((auVar68._0_4_ < 0.0) || (1.0 < auVar68._0_4_)) goto LAB_01ac00a6;
                    auVar198._0_12_ = ZEXT812(0);
                    auVar198._12_4_ = 0;
                    auVar116._0_16_ = auVar198;
                    auVar115._4_28_ = auVar116._4_28_;
                    auVar115._0_4_ = local_8c0._0_4_;
                    auVar68 = vrsqrt14ss_avx512f(auVar198,auVar115._0_16_);
                    fVar218 = auVar68._0_4_;
                    auVar68 = vmulss_avx512f(local_8c0._0_16_,ZEXT416(0xbf000000));
                    pGVar2 = (context->scene->geometries).items[uVar57].ptr;
                    if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_01ac007e;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar51 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_01ac00a6;
                    fVar218 = fVar218 * 1.5 + auVar68._0_4_ * fVar218 * fVar218 * fVar218;
                    auVar175._0_4_ = local_8a0._0_4_ * fVar218;
                    auVar175._4_4_ = local_8a0._4_4_ * fVar218;
                    auVar175._8_4_ = local_8a0._8_4_ * fVar218;
                    auVar175._12_4_ = local_8a0._12_4_ * fVar218;
                    auVar71 = vfmadd213ps_fma(auVar69,auVar175,auVar65);
                    auVar68 = vshufps_avx(auVar175,auVar175,0xc9);
                    auVar70 = vshufps_avx(auVar65,auVar65,0xc9);
                    auVar176._0_4_ = auVar175._0_4_ * auVar70._0_4_;
                    auVar176._4_4_ = auVar175._4_4_ * auVar70._4_4_;
                    auVar176._8_4_ = auVar175._8_4_ * auVar70._8_4_;
                    auVar176._12_4_ = auVar175._12_4_ * auVar70._12_4_;
                    auVar70 = vfmsub231ps_fma(auVar176,auVar65,auVar68);
                    auVar65 = vshufps_avx(auVar70,auVar70,0xc9);
                    auVar68 = vshufps_avx(auVar71,auVar71,0xc9);
                    auVar70 = vshufps_avx(auVar70,auVar70,0xd2);
                    auVar136._0_4_ = auVar71._0_4_ * auVar70._0_4_;
                    auVar136._4_4_ = auVar71._4_4_ * auVar70._4_4_;
                    auVar136._8_4_ = auVar71._8_4_ * auVar70._8_4_;
                    auVar136._12_4_ = auVar71._12_4_ * auVar70._12_4_;
                    auVar65 = vfmsub231ps_fma(auVar136,auVar65,auVar68);
                    local_4f0 = vshufps_avx(auVar67,auVar67,0x55);
                    local_520 = (RTCHitN  [16])vshufps_avx(auVar65,auVar65,0x55);
                    auStack_510 = vshufps_avx(auVar65,auVar65,0xaa);
                    local_500 = auVar65._0_4_;
                    uStack_4fc = local_500;
                    uStack_4f8 = local_500;
                    uStack_4f4 = local_500;
                    local_4e0 = ZEXT416(0) << 0x20;
                    local_4d0 = local_530._0_8_;
                    uStack_4c8 = local_530._8_8_;
                    local_4c0 = local_540;
                    vpcmpeqd_avx2(ZEXT1632(local_540),ZEXT1632(local_540));
                    uStack_4ac = context->user->instID[0];
                    local_4b0 = uStack_4ac;
                    uStack_4a8 = uStack_4ac;
                    uStack_4a4 = uStack_4ac;
                    uStack_4a0 = context->user->instPrimID[0];
                    uStack_49c = uStack_4a0;
                    uStack_498 = uStack_4a0;
                    uStack_494 = uStack_4a0;
                    *(float *)(ray + k * 4 + 0x80) = fVar216;
                    local_9a0 = local_550;
                    local_790.valid = (int *)local_9a0;
                    local_790.geometryUserPtr = pGVar2->userPtr;
                    local_790.context = context->user;
                    local_790.hit = local_520;
                    local_790.N = 4;
                    local_790.ray = (RTCRayN *)ray;
                    if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar236 = ZEXT1664(auVar233);
                      auVar241 = ZEXT1664(auVar239);
                      auVar245 = ZEXT1664(local_8a0._0_16_);
                      auVar247 = ZEXT1664(auVar134);
                      (*pGVar2->occlusionFilterN)(&local_790);
                      auVar266 = ZEXT3264(local_880);
                      auVar265 = ZEXT3264(local_860);
                      auVar264 = ZEXT3264(local_840);
                      auVar263 = ZEXT3264(local_960);
                      auVar262 = ZEXT3264(local_940);
                      auVar261 = ZEXT3264(local_820);
                      auVar260 = ZEXT3264(local_920);
                      auVar259 = ZEXT3264(local_800);
                      auVar258 = ZEXT3264(local_900);
                      auVar257 = ZEXT3264(local_8e0);
                      fVar129 = (float)local_980._0_4_;
                      fVar190 = (float)local_980._4_4_;
                      fVar205 = fStack_978;
                      fVar206 = fStack_974;
                      fVar207 = fStack_970;
                      fVar208 = fStack_96c;
                      fVar209 = fStack_968;
                      fVar210 = fStack_964;
                    }
                    uVar59 = vptestmd_avx512vl(local_9a0,local_9a0);
                    if ((uVar59 & 0xf) != 0) {
                      p_Var3 = context->args->filter;
                      if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar236 = ZEXT1664(auVar236._0_16_);
                        auVar241 = ZEXT1664(auVar241._0_16_);
                        auVar245 = ZEXT1664(auVar245._0_16_);
                        auVar247 = ZEXT1664(auVar247._0_16_);
                        (*p_Var3)(&local_790);
                        auVar266 = ZEXT3264(local_880);
                        auVar265 = ZEXT3264(local_860);
                        auVar264 = ZEXT3264(local_840);
                        auVar263 = ZEXT3264(local_960);
                        auVar262 = ZEXT3264(local_940);
                        auVar261 = ZEXT3264(local_820);
                        auVar260 = ZEXT3264(local_920);
                        auVar259 = ZEXT3264(local_800);
                        auVar258 = ZEXT3264(local_900);
                        auVar257 = ZEXT3264(local_8e0);
                        fVar129 = (float)local_980._0_4_;
                        fVar190 = (float)local_980._4_4_;
                        fVar205 = fStack_978;
                        fVar206 = fStack_974;
                        fVar207 = fStack_970;
                        fVar208 = fStack_96c;
                        fVar209 = fStack_968;
                        fVar210 = fStack_964;
                      }
                      uVar59 = vptestmd_avx512vl(local_9a0,local_9a0);
                      uVar59 = uVar59 & 0xf;
                      auVar67 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar4 = (bool)((byte)uVar59 & 1);
                      bVar5 = (bool)((byte)(uVar59 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar59 >> 2) & 1);
                      bVar7 = SUB81(uVar59 >> 3,0);
                      *(uint *)(local_790.ray + 0x80) =
                           (uint)bVar4 * auVar67._0_4_ |
                           (uint)!bVar4 * *(int *)(local_790.ray + 0x80);
                      *(uint *)(local_790.ray + 0x84) =
                           (uint)bVar5 * auVar67._4_4_ |
                           (uint)!bVar5 * *(int *)(local_790.ray + 0x84);
                      *(uint *)(local_790.ray + 0x88) =
                           (uint)bVar6 * auVar67._8_4_ |
                           (uint)!bVar6 * *(int *)(local_790.ray + 0x88);
                      *(uint *)(local_790.ray + 0x8c) =
                           (uint)bVar7 * auVar67._12_4_ |
                           (uint)!bVar7 * *(int *)(local_790.ray + 0x8c);
                      bVar51 = 1;
                      if ((byte)uVar59 != 0) goto LAB_01ac00a6;
                    }
                    *(float *)(ray + k * 4 + 0x80) = fVar217;
                  }
                  bVar51 = 0;
                  goto LAB_01ac00a6;
                }
              }
              bVar58 = uVar59 < 4;
              uVar59 = uVar59 + 1;
            } while (uVar59 != 5);
            bVar58 = false;
            bVar51 = 5;
LAB_01ac00a6:
            bVar56 = (bool)(bVar56 | bVar58 & bVar51);
            uVar148 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar145._4_4_ = uVar148;
            auVar145._0_4_ = uVar148;
            auVar145._8_4_ = uVar148;
            auVar145._12_4_ = uVar148;
            auVar145._16_4_ = uVar148;
            auVar145._20_4_ = uVar148;
            auVar145._24_4_ = uVar148;
            auVar145._28_4_ = uVar148;
            auVar46._4_4_ = fStack_3fc;
            auVar46._0_4_ = local_400;
            auVar46._8_4_ = fStack_3f8;
            auVar46._12_4_ = fStack_3f4;
            auVar46._16_4_ = fStack_3f0;
            auVar46._20_4_ = fStack_3ec;
            auVar46._24_4_ = fStack_3e8;
            auVar46._28_4_ = fStack_3e4;
            uVar12 = vcmpps_avx512vl(auVar145,auVar46,0xd);
            bVar52 = ~('\x01' << ((byte)iVar15 & 0x1f)) & bVar52 & (byte)uVar12;
            auVar75 = local_360;
          } while (bVar52 != 0);
        }
        auVar231 = ZEXT3264(local_3a0);
        bVar52 = local_420[0] | (byte)local_990;
        auVar164._0_4_ = fVar129 + auVar75._0_4_;
        auVar164._4_4_ = fVar190 + auVar75._4_4_;
        auVar164._8_4_ = fVar205 + auVar75._8_4_;
        auVar164._12_4_ = fVar206 + auVar75._12_4_;
        auVar164._16_4_ = fVar207 + auVar75._16_4_;
        auVar164._20_4_ = fVar208 + auVar75._20_4_;
        auVar164._24_4_ = fVar209 + auVar75._24_4_;
        auVar164._28_4_ = fVar210 + auVar75._28_4_;
        uVar12 = vcmpps_avx512vl(auVar164,auVar145,2);
        bVar49 = (byte)uVar13 & bVar49 & (byte)uVar12;
        auVar165._8_4_ = 2;
        auVar165._0_8_ = 0x200000002;
        auVar165._12_4_ = 2;
        auVar165._16_4_ = 2;
        auVar165._20_4_ = 2;
        auVar165._24_4_ = 2;
        auVar165._28_4_ = 2;
        auVar29._8_4_ = 3;
        auVar29._0_8_ = 0x300000003;
        auVar29._12_4_ = 3;
        auVar29._16_4_ = 3;
        auVar29._20_4_ = 3;
        auVar29._24_4_ = 3;
        auVar29._28_4_ = 3;
        auVar75 = vpblendmd_avx512vl(auVar165,auVar29);
        auVar117._0_4_ = (uint)(bVar52 & 1) * auVar75._0_4_ | (uint)!(bool)(bVar52 & 1) * 2;
        bVar58 = (bool)(bVar52 >> 1 & 1);
        auVar117._4_4_ = (uint)bVar58 * auVar75._4_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar52 >> 2 & 1);
        auVar117._8_4_ = (uint)bVar58 * auVar75._8_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar52 >> 3 & 1);
        auVar117._12_4_ = (uint)bVar58 * auVar75._12_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar52 >> 4 & 1);
        auVar117._16_4_ = (uint)bVar58 * auVar75._16_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar52 >> 5 & 1);
        auVar117._20_4_ = (uint)bVar58 * auVar75._20_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar52 >> 6 & 1);
        auVar117._24_4_ = (uint)bVar58 * auVar75._24_4_ | (uint)!bVar58 * 2;
        auVar117._28_4_ = (uint)(bVar52 >> 7) * auVar75._28_4_ | (uint)!(bool)(bVar52 >> 7) * 2;
        uVar12 = vpcmpd_avx512vl(local_3c0,auVar117,5);
        bVar52 = (byte)uVar12 & bVar49;
        if (bVar52 != 0) {
          local_420 = auVar117;
          auVar65 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar67 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar68 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar70 = vminps_avx(auVar65,auVar68);
          auVar65 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar68 = vmaxps_avx(auVar67,auVar65);
          auVar177._8_4_ = 0x7fffffff;
          auVar177._0_8_ = 0x7fffffff7fffffff;
          auVar177._12_4_ = 0x7fffffff;
          auVar67 = vandps_avx(auVar70,auVar177);
          auVar65 = vandps_avx(auVar68,auVar177);
          auVar67 = vmaxps_avx(auVar67,auVar65);
          auVar65 = vmovshdup_avx(auVar67);
          auVar65 = vmaxss_avx(auVar65,auVar67);
          auVar67 = vshufpd_avx(auVar67,auVar67,1);
          auVar67 = vmaxss_avx(auVar67,auVar65);
          fVar211 = auVar67._0_4_ * 1.9073486e-06;
          local_620 = vshufps_avx(auVar68,auVar68,0xff);
          local_400 = fVar129 + local_3a0._0_4_;
          fStack_3fc = fVar190 + local_3a0._4_4_;
          fStack_3f8 = fVar205 + local_3a0._8_4_;
          fStack_3f4 = fVar206 + local_3a0._12_4_;
          fStack_3f0 = fVar207 + local_3a0._16_4_;
          fStack_3ec = fVar208 + local_3a0._20_4_;
          fStack_3e8 = fVar209 + local_3a0._24_4_;
          fStack_3e4 = fVar210 + local_3a0._28_4_;
          _local_760 = local_3a0;
          do {
            auVar146._8_4_ = 0x7f800000;
            auVar146._0_8_ = 0x7f8000007f800000;
            auVar146._12_4_ = 0x7f800000;
            auVar146._16_4_ = 0x7f800000;
            auVar146._20_4_ = 0x7f800000;
            auVar146._24_4_ = 0x7f800000;
            auVar146._28_4_ = 0x7f800000;
            auVar75 = vblendmps_avx512vl(auVar146,auVar231._0_32_);
            auVar118._0_4_ =
                 (uint)(bVar52 & 1) * auVar75._0_4_ | (uint)!(bool)(bVar52 & 1) * 0x7f800000;
            bVar58 = (bool)(bVar52 >> 1 & 1);
            auVar118._4_4_ = (uint)bVar58 * auVar75._4_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar52 >> 2 & 1);
            auVar118._8_4_ = (uint)bVar58 * auVar75._8_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar52 >> 3 & 1);
            auVar118._12_4_ = (uint)bVar58 * auVar75._12_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar52 >> 4 & 1);
            auVar118._16_4_ = (uint)bVar58 * auVar75._16_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar52 >> 5 & 1);
            auVar118._20_4_ = (uint)bVar58 * auVar75._20_4_ | (uint)!bVar58 * 0x7f800000;
            auVar118._24_4_ =
                 (uint)(bVar52 >> 6) * auVar75._24_4_ | (uint)!(bool)(bVar52 >> 6) * 0x7f800000;
            auVar118._28_4_ = 0x7f800000;
            auVar75 = vshufps_avx(auVar118,auVar118,0xb1);
            auVar75 = vminps_avx(auVar118,auVar75);
            auVar76 = vshufpd_avx(auVar75,auVar75,5);
            auVar75 = vminps_avx(auVar75,auVar76);
            auVar76 = vpermpd_avx2(auVar75,0x4e);
            auVar75 = vminps_avx(auVar75,auVar76);
            uVar12 = vcmpps_avx512vl(auVar118,auVar75,0);
            bVar50 = (byte)uVar12 & bVar52;
            bVar51 = bVar52;
            if (bVar50 != 0) {
              bVar51 = bVar50;
            }
            iVar15 = 0;
            for (uVar62 = (uint)bVar51; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
              iVar15 = iVar15 + 1;
            }
            fVar216 = local_984;
            auVar67 = ZEXT416(*(uint *)(local_380 + (uint)(iVar15 << 2)));
            auVar65 = ZEXT416(*(uint *)(local_200 + (uint)(iVar15 << 2)));
            if ((float)local_700._0_4_ < 0.0) {
              local_8a0._0_16_ = ZEXT416(*(uint *)(local_200 + (uint)(iVar15 << 2)));
              local_8c0._0_16_ = ZEXT416(*(uint *)(local_380 + (uint)(iVar15 << 2)));
              fVar216 = sqrtf((float)local_700._0_4_);
              auVar67 = local_8c0._0_16_;
              auVar65 = local_8a0._0_16_;
            }
            auVar67 = vinsertps_avx(auVar67,auVar65,0x10);
            bVar58 = true;
            uVar59 = 0;
            do {
              uVar148 = auVar67._0_4_;
              auVar137._4_4_ = uVar148;
              auVar137._0_4_ = uVar148;
              auVar137._8_4_ = uVar148;
              auVar137._12_4_ = uVar148;
              auVar65 = vfmadd132ps_fma(auVar137,ZEXT816(0) << 0x40,local_6f0);
              auVar68 = vmovshdup_avx(auVar67);
              fVar209 = auVar68._0_4_;
              fVar208 = 1.0 - fVar209;
              fVar129 = fVar209 * fVar209;
              auVar238 = SUB6416(ZEXT464(0x40400000),0);
              auVar72 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar71 = vfmadd213ss_fma(auVar238,auVar68,auVar72);
              auVar70 = vfmadd213ss_fma(auVar71,ZEXT416((uint)fVar129),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar69 = vfmadd213ss_fma(auVar238,ZEXT416((uint)fVar208),auVar72);
              auVar69 = vfmadd213ss_fma(auVar69,ZEXT416((uint)(fVar208 * fVar208)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar190 = fVar208 * fVar208 * -fVar209 * 0.5;
              fVar205 = auVar70._0_4_ * 0.5;
              fVar206 = auVar69._0_4_ * 0.5;
              fVar207 = fVar209 * fVar209 * -fVar208 * 0.5;
              auVar199._0_4_ = fVar207 * (float)local_6e0._0_4_;
              auVar199._4_4_ = fVar207 * (float)local_6e0._4_4_;
              auVar199._8_4_ = fVar207 * fStack_6d8;
              auVar199._12_4_ = fVar207 * fStack_6d4;
              auVar215._4_4_ = fVar206;
              auVar215._0_4_ = fVar206;
              auVar215._8_4_ = fVar206;
              auVar215._12_4_ = fVar206;
              auVar70 = vfmadd132ps_fma(auVar215,auVar199,local_6a0._0_16_);
              auVar178._4_4_ = fVar205;
              auVar178._0_4_ = fVar205;
              auVar178._8_4_ = fVar205;
              auVar178._12_4_ = fVar205;
              auVar70 = vfmadd132ps_fma(auVar178,auVar70,local_6c0._0_16_);
              auVar200._4_4_ = fVar190;
              auVar200._0_4_ = fVar190;
              auVar200._8_4_ = fVar190;
              auVar200._12_4_ = fVar190;
              auVar70 = vfmadd132ps_fma(auVar200,auVar70,local_680._0_16_);
              auVar69 = vfmadd231ss_fma(auVar72,auVar68,ZEXT416(0x41100000));
              local_5a0._0_16_ = auVar69;
              auVar69 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar68,ZEXT416(0x40800000));
              local_5c0._0_16_ = auVar69;
              auVar69 = vfmadd213ss_fma(auVar238,auVar68,ZEXT416(0xbf800000));
              local_5e0._0_16_ = auVar69;
              _local_580 = auVar70;
              auVar65 = vsubps_avx(auVar65,auVar70);
              local_8a0._0_16_ = auVar65;
              auVar65 = vdpps_avx(auVar65,auVar65,0x7f);
              local_8c0._0_16_ = auVar65;
              local_660._0_16_ = auVar67;
              if (auVar65._0_4_ < 0.0) {
                local_7c0._0_4_ = auVar71._0_4_;
                local_7e0._0_16_ = ZEXT416((uint)fVar208);
                local_720._0_4_ = fVar129;
                local_740._0_4_ = fVar208 * -2.0;
                auVar245._0_4_ = sqrtf(auVar65._0_4_);
                auVar245._4_60_ = extraout_var_00;
                auVar71 = ZEXT416((uint)local_7c0._0_4_);
                auVar67 = auVar245._0_16_;
                auVar65 = local_7e0._0_16_;
              }
              else {
                auVar67 = vsqrtss_avx(auVar65,auVar65);
                local_740._0_4_ = fVar208 * -2.0;
                local_720._0_4_ = fVar129;
                auVar65 = ZEXT416((uint)fVar208);
              }
              fVar129 = auVar65._0_4_;
              auVar69 = vfnmadd231ss_fma(ZEXT416((uint)(fVar209 * (fVar129 + fVar129))),auVar65,
                                         auVar65);
              auVar65 = vfmadd213ss_fma(auVar71,ZEXT416((uint)(fVar209 + fVar209)),
                                        ZEXT416((uint)(fVar209 * fVar209 * 3.0)));
              auVar70 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar68,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar71 = vfmadd231ss_fma(ZEXT416((uint)(fVar129 * fVar129 * -3.0)),
                                        ZEXT416((uint)(fVar129 + fVar129)),auVar70);
              auVar70 = vfmadd213ss_fma(ZEXT416((uint)local_740._0_4_),auVar68,
                                        ZEXT416((uint)local_720._0_4_));
              fVar129 = auVar69._0_4_ * 0.5;
              fVar190 = auVar65._0_4_ * 0.5;
              fVar205 = auVar71._0_4_ * 0.5;
              fVar206 = auVar70._0_4_ * 0.5;
              auVar201._0_4_ = fVar206 * (float)local_6e0._0_4_;
              auVar201._4_4_ = fVar206 * (float)local_6e0._4_4_;
              auVar201._8_4_ = fVar206 * fStack_6d8;
              auVar201._12_4_ = fVar206 * fStack_6d4;
              auVar179._4_4_ = fVar205;
              auVar179._0_4_ = fVar205;
              auVar179._8_4_ = fVar205;
              auVar179._12_4_ = fVar205;
              auVar65 = vfmadd132ps_fma(auVar179,auVar201,local_6a0._0_16_);
              auVar157._4_4_ = fVar190;
              auVar157._0_4_ = fVar190;
              auVar157._8_4_ = fVar190;
              auVar157._12_4_ = fVar190;
              auVar65 = vfmadd132ps_fma(auVar157,auVar65,local_6c0._0_16_);
              auVar250._4_4_ = fVar129;
              auVar250._0_4_ = fVar129;
              auVar250._8_4_ = fVar129;
              auVar250._12_4_ = fVar129;
              local_7c0._0_16_ = vfmadd132ps_fma(auVar250,auVar65,local_680._0_16_);
              local_720._0_16_ = vdpps_avx(local_7c0._0_16_,local_7c0._0_16_,0x7f);
              auVar45._12_4_ = 0;
              auVar45._0_12_ = ZEXT812(0);
              fVar129 = local_720._0_4_;
              auVar65 = vrsqrt14ss_avx512f(auVar45 << 0x20,ZEXT416((uint)fVar129));
              fVar190 = auVar65._0_4_;
              local_740._0_16_ = vrcp14ss_avx512f(auVar45 << 0x20,ZEXT416((uint)fVar129));
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar70 = vxorps_avx512vl(local_720._0_16_,auVar21);
              auVar65 = vfnmadd213ss_fma(local_740._0_16_,local_720._0_16_,
                                         SUB6416(ZEXT464(0x40000000),0));
              local_7a0._0_4_ = auVar65._0_4_;
              local_7e0._0_4_ = auVar67._0_4_;
              if (fVar129 < auVar70._0_4_) {
                fVar205 = sqrtf(fVar129);
                auVar67 = ZEXT416((uint)local_7e0._0_4_);
                auVar65 = local_7c0._0_16_;
              }
              else {
                auVar65 = vsqrtss_avx(local_720._0_16_,local_720._0_16_);
                fVar205 = auVar65._0_4_;
                auVar65 = local_7c0._0_16_;
              }
              fVar129 = fVar190 * 1.5 + fVar129 * -0.5 * fVar190 * fVar190 * fVar190;
              auVar138._0_4_ = auVar65._0_4_ * fVar129;
              auVar138._4_4_ = auVar65._4_4_ * fVar129;
              auVar138._8_4_ = auVar65._8_4_ * fVar129;
              auVar138._12_4_ = auVar65._12_4_ * fVar129;
              auVar70 = vdpps_avx(local_8a0._0_16_,auVar138,0x7f);
              fVar207 = auVar67._0_4_;
              fVar190 = auVar70._0_4_;
              auVar139._0_4_ = fVar190 * fVar190;
              auVar139._4_4_ = auVar70._4_4_ * auVar70._4_4_;
              auVar139._8_4_ = auVar70._8_4_ * auVar70._8_4_;
              auVar139._12_4_ = auVar70._12_4_ * auVar70._12_4_;
              auVar71 = vsubps_avx512vl(local_8c0._0_16_,auVar139);
              fVar206 = auVar71._0_4_;
              auVar158._4_12_ = ZEXT812(0) << 0x20;
              auVar158._0_4_ = fVar206;
              auVar69 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar158);
              auVar72 = vmulss_avx512f(auVar71,ZEXT416(0xbf000000));
              if (fVar206 < 0.0) {
                local_610 = fVar129;
                fStack_60c = fVar129;
                fStack_608 = fVar129;
                fStack_604 = fVar129;
                local_600 = auVar69;
                fVar217 = sqrtf(fVar206);
                auVar72 = ZEXT416(auVar72._0_4_);
                auVar67 = ZEXT416((uint)local_7e0._0_4_);
                auVar71 = local_600;
                auVar65 = local_7c0._0_16_;
                fVar129 = local_610;
                fVar206 = fStack_60c;
                fVar208 = fStack_608;
                fVar209 = fStack_604;
              }
              else {
                auVar71 = vsqrtss_avx(auVar71,auVar71);
                fVar217 = auVar71._0_4_;
                auVar71 = auVar69;
                fVar206 = fVar129;
                fVar208 = fVar129;
                fVar209 = fVar129;
              }
              auVar245 = ZEXT1664(local_8a0._0_16_);
              auVar257 = ZEXT3264(local_8e0);
              auVar258 = ZEXT3264(local_900);
              auVar259 = ZEXT3264(local_800);
              auVar260 = ZEXT3264(local_920);
              auVar261 = ZEXT3264(local_820);
              auVar262 = ZEXT3264(local_940);
              auVar263 = ZEXT3264(local_960);
              auVar264 = ZEXT3264(local_840);
              auVar265 = ZEXT3264(local_860);
              auVar266 = ZEXT3264(local_880);
              auVar159._0_4_ = (float)local_5e0._0_4_ * (float)local_6e0._0_4_;
              auVar159._4_4_ = (float)local_5e0._0_4_ * (float)local_6e0._4_4_;
              auVar159._8_4_ = (float)local_5e0._0_4_ * fStack_6d8;
              auVar159._12_4_ = (float)local_5e0._0_4_ * fStack_6d4;
              auVar180._4_4_ = local_5c0._0_4_;
              auVar180._0_4_ = local_5c0._0_4_;
              auVar180._8_4_ = local_5c0._0_4_;
              auVar180._12_4_ = local_5c0._0_4_;
              auVar238 = vfmadd132ps_fma(auVar180,auVar159,local_6a0._0_16_);
              auVar160._4_4_ = local_5a0._0_4_;
              auVar160._0_4_ = local_5a0._0_4_;
              auVar160._8_4_ = local_5a0._0_4_;
              auVar160._12_4_ = local_5a0._0_4_;
              auVar238 = vfmadd132ps_fma(auVar160,auVar238,local_6c0._0_16_);
              auVar68 = vfmadd213ss_fma(auVar68,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
              uVar148 = auVar68._0_4_;
              auVar181._4_4_ = uVar148;
              auVar181._0_4_ = uVar148;
              auVar181._8_4_ = uVar148;
              auVar181._12_4_ = uVar148;
              auVar68 = vfmadd132ps_fma(auVar181,auVar238,local_680._0_16_);
              auVar161._0_4_ = auVar68._0_4_ * (float)local_720._0_4_;
              auVar161._4_4_ = auVar68._4_4_ * (float)local_720._0_4_;
              auVar161._8_4_ = auVar68._8_4_ * (float)local_720._0_4_;
              auVar161._12_4_ = auVar68._12_4_ * (float)local_720._0_4_;
              auVar68 = vdpps_avx(auVar65,auVar68,0x7f);
              fVar210 = auVar68._0_4_;
              auVar182._0_4_ = auVar65._0_4_ * fVar210;
              auVar182._4_4_ = auVar65._4_4_ * fVar210;
              auVar182._8_4_ = auVar65._8_4_ * fVar210;
              auVar182._12_4_ = auVar65._12_4_ * fVar210;
              auVar68 = vsubps_avx(auVar161,auVar182);
              fVar210 = (float)local_7a0._0_4_ * (float)local_740._0_4_;
              auVar238 = vmaxss_avx(ZEXT416((uint)fVar211),
                                    ZEXT416((uint)(local_660._0_4_ * fVar216 * 1.9073486e-06)));
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar120._16_16_ = local_880._16_16_;
              auVar73 = vxorps_avx512vl(auVar65,auVar22);
              auVar183._0_4_ = fVar129 * auVar68._0_4_ * fVar210;
              auVar183._4_4_ = fVar206 * auVar68._4_4_ * fVar210;
              auVar183._8_4_ = fVar208 * auVar68._8_4_ * fVar210;
              auVar183._12_4_ = fVar209 * auVar68._12_4_ * fVar210;
              auVar247 = ZEXT1664(auVar138);
              auVar68 = vdpps_avx(auVar73,auVar138,0x7f);
              auVar11 = vfmadd213ss_fma(auVar67,ZEXT416((uint)fVar211),auVar238);
              auVar67 = vdpps_avx(local_8a0._0_16_,auVar183,0x7f);
              auVar11 = vfmadd213ss_fma(ZEXT416((uint)(fVar207 + 1.0)),
                                        ZEXT416((uint)(fVar211 / fVar205)),auVar11);
              fVar129 = auVar68._0_4_ + auVar67._0_4_;
              auVar67 = vdpps_avx(local_6f0,auVar138,0x7f);
              auVar68 = vdpps_avx(local_8a0._0_16_,auVar73,0x7f);
              auVar72 = vmulss_avx512f(auVar72,auVar71);
              fVar205 = auVar69._0_4_ * 1.5 + auVar72._0_4_ * auVar71._0_4_ * auVar71._0_4_;
              auVar71 = vdpps_avx(local_8a0._0_16_,local_6f0,0x7f);
              auVar72 = vfnmadd231ss_fma(auVar68,auVar70,ZEXT416((uint)fVar129));
              auVar71 = vfnmadd231ss_fma(auVar71,auVar70,auVar67);
              auVar68 = vpermilps_avx(_local_580,0xff);
              fVar217 = fVar217 - auVar68._0_4_;
              auVar69 = vshufps_avx(auVar65,auVar65,0xff);
              auVar68 = vfmsub213ss_fma(auVar72,ZEXT416((uint)fVar205),auVar69);
              auVar240._8_4_ = 0x80000000;
              auVar240._0_8_ = 0x8000000080000000;
              auVar240._12_4_ = 0x80000000;
              auVar241 = ZEXT1664(auVar240);
              auVar234._0_8_ = auVar68._0_8_ ^ 0x8000000080000000;
              auVar234._8_4_ = auVar68._8_4_ ^ 0x80000000;
              auVar234._12_4_ = auVar68._12_4_ ^ 0x80000000;
              auVar236 = ZEXT1664(auVar234);
              auVar71 = ZEXT416((uint)(auVar71._0_4_ * fVar205));
              auVar72 = vfmsub231ss_fma(ZEXT416((uint)(auVar67._0_4_ * auVar68._0_4_)),
                                        ZEXT416((uint)fVar129),auVar71);
              auVar68 = vinsertps_avx(auVar234,auVar71,0x1c);
              auVar223._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
              auVar223._8_4_ = auVar67._8_4_ ^ 0x80000000;
              auVar223._12_4_ = auVar67._12_4_ ^ 0x80000000;
              auVar71 = vinsertps_avx(ZEXT416((uint)fVar129),auVar223,0x10);
              auVar202._0_4_ = auVar72._0_4_;
              auVar202._4_4_ = auVar202._0_4_;
              auVar202._8_4_ = auVar202._0_4_;
              auVar202._12_4_ = auVar202._0_4_;
              auVar67 = vdivps_avx(auVar68,auVar202);
              auVar68 = vdivps_avx(auVar71,auVar202);
              auVar203._0_4_ = fVar190 * auVar67._0_4_ + fVar217 * auVar68._0_4_;
              auVar203._4_4_ = fVar190 * auVar67._4_4_ + fVar217 * auVar68._4_4_;
              auVar203._8_4_ = fVar190 * auVar67._8_4_ + fVar217 * auVar68._8_4_;
              auVar203._12_4_ = fVar190 * auVar67._12_4_ + fVar217 * auVar68._12_4_;
              auVar67 = vsubps_avx(local_660._0_16_,auVar203);
              auVar23._8_4_ = 0x7fffffff;
              auVar23._0_8_ = 0x7fffffff7fffffff;
              auVar23._12_4_ = 0x7fffffff;
              auVar68 = vandps_avx512vl(auVar70,auVar23);
              fVar129 = (float)local_980._0_4_;
              fVar190 = (float)local_980._4_4_;
              fVar205 = fStack_978;
              fVar206 = fStack_974;
              fVar207 = fStack_970;
              fVar208 = fStack_96c;
              fVar209 = fStack_968;
              fVar210 = fStack_964;
              if (auVar68._0_4_ < auVar11._0_4_) {
                auVar68 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ + auVar238._0_4_)),local_620,
                                          ZEXT416(0x36000000));
                auVar24._8_4_ = 0x7fffffff;
                auVar24._0_8_ = 0x7fffffff7fffffff;
                auVar24._12_4_ = 0x7fffffff;
                auVar70 = vandps_avx512vl(ZEXT416((uint)fVar217),auVar24);
                if (auVar70._0_4_ < auVar68._0_4_) {
                  fVar216 = auVar67._0_4_ + (float)local_630._0_4_;
                  if (fVar216 < fVar147) {
                    bVar51 = 0;
                    goto LAB_01ac0cfa;
                  }
                  fVar217 = *(float *)(ray + k * 4 + 0x80);
                  auVar236 = ZEXT464((uint)fVar217);
                  auVar231 = ZEXT3264(_local_760);
                  if (fVar216 <= fVar217) {
                    auVar68 = vmovshdup_avx(auVar67);
                    bVar51 = 0;
                    if ((auVar68._0_4_ < 0.0) || (1.0 < auVar68._0_4_)) goto LAB_01ac0d03;
                    auVar204._0_12_ = ZEXT812(0);
                    auVar204._12_4_ = 0;
                    auVar120._0_16_ = auVar204;
                    auVar119._4_28_ = auVar120._4_28_;
                    auVar119._0_4_ = local_8c0._0_4_;
                    auVar68 = vrsqrt14ss_avx512f(auVar204,auVar119._0_16_);
                    fVar218 = auVar68._0_4_;
                    auVar68 = vmulss_avx512f(local_8c0._0_16_,ZEXT416(0xbf000000));
                    pGVar2 = (context->scene->geometries).items[uVar57].ptr;
                    if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                      bVar51 = 0;
                      goto LAB_01ac0d03;
                    }
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar51 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_01ac0d03;
                    fVar218 = fVar218 * 1.5 + auVar68._0_4_ * fVar218 * fVar218 * fVar218;
                    auVar184._0_4_ = local_8a0._0_4_ * fVar218;
                    auVar184._4_4_ = local_8a0._4_4_ * fVar218;
                    auVar184._8_4_ = local_8a0._8_4_ * fVar218;
                    auVar184._12_4_ = local_8a0._12_4_ * fVar218;
                    auVar71 = vfmadd213ps_fma(auVar69,auVar184,auVar65);
                    auVar68 = vshufps_avx(auVar184,auVar184,0xc9);
                    auVar70 = vshufps_avx(auVar65,auVar65,0xc9);
                    auVar185._0_4_ = auVar184._0_4_ * auVar70._0_4_;
                    auVar185._4_4_ = auVar184._4_4_ * auVar70._4_4_;
                    auVar185._8_4_ = auVar184._8_4_ * auVar70._8_4_;
                    auVar185._12_4_ = auVar184._12_4_ * auVar70._12_4_;
                    auVar70 = vfmsub231ps_fma(auVar185,auVar65,auVar68);
                    auVar65 = vshufps_avx(auVar70,auVar70,0xc9);
                    auVar68 = vshufps_avx(auVar71,auVar71,0xc9);
                    auVar70 = vshufps_avx(auVar70,auVar70,0xd2);
                    auVar140._0_4_ = auVar71._0_4_ * auVar70._0_4_;
                    auVar140._4_4_ = auVar71._4_4_ * auVar70._4_4_;
                    auVar140._8_4_ = auVar71._8_4_ * auVar70._8_4_;
                    auVar140._12_4_ = auVar71._12_4_ * auVar70._12_4_;
                    auVar65 = vfmsub231ps_fma(auVar140,auVar65,auVar68);
                    local_4f0 = vshufps_avx(auVar67,auVar67,0x55);
                    local_520 = (RTCHitN  [16])vshufps_avx(auVar65,auVar65,0x55);
                    auStack_510 = vshufps_avx(auVar65,auVar65,0xaa);
                    local_500 = auVar65._0_4_;
                    uStack_4fc = local_500;
                    uStack_4f8 = local_500;
                    uStack_4f4 = local_500;
                    local_4e0 = ZEXT416(0) << 0x20;
                    local_4d0 = local_530._0_8_;
                    uStack_4c8 = local_530._8_8_;
                    local_4c0 = local_540;
                    vpcmpeqd_avx2(ZEXT1632(local_540),ZEXT1632(local_540));
                    uStack_4ac = context->user->instID[0];
                    local_4b0 = uStack_4ac;
                    uStack_4a8 = uStack_4ac;
                    uStack_4a4 = uStack_4ac;
                    uStack_4a0 = context->user->instPrimID[0];
                    uStack_49c = uStack_4a0;
                    uStack_498 = uStack_4a0;
                    uStack_494 = uStack_4a0;
                    *(float *)(ray + k * 4 + 0x80) = fVar216;
                    local_9a0 = local_550;
                    local_790.valid = (int *)local_9a0;
                    local_790.geometryUserPtr = pGVar2->userPtr;
                    local_790.context = context->user;
                    local_790.hit = local_520;
                    local_790.N = 4;
                    local_790.ray = (RTCRayN *)ray;
                    if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar241 = ZEXT1664(auVar240);
                      auVar245 = ZEXT1664(local_8a0._0_16_);
                      auVar247 = ZEXT1664(auVar138);
                      (*pGVar2->occlusionFilterN)(&local_790);
                      auVar231 = ZEXT3264(_local_760);
                      auVar266 = ZEXT3264(local_880);
                      auVar265 = ZEXT3264(local_860);
                      auVar264 = ZEXT3264(local_840);
                      auVar263 = ZEXT3264(local_960);
                      auVar262 = ZEXT3264(local_940);
                      auVar261 = ZEXT3264(local_820);
                      auVar260 = ZEXT3264(local_920);
                      auVar259 = ZEXT3264(local_800);
                      auVar258 = ZEXT3264(local_900);
                      auVar257 = ZEXT3264(local_8e0);
                      fVar129 = (float)local_980._0_4_;
                      fVar190 = (float)local_980._4_4_;
                      fVar205 = fStack_978;
                      fVar206 = fStack_974;
                      fVar207 = fStack_970;
                      fVar208 = fStack_96c;
                      fVar209 = fStack_968;
                      fVar210 = fStack_964;
                    }
                    uVar59 = vptestmd_avx512vl(local_9a0,local_9a0);
                    if ((uVar59 & 0xf) != 0) {
                      p_Var3 = context->args->filter;
                      if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar241 = ZEXT1664(auVar241._0_16_);
                        auVar245 = ZEXT1664(auVar245._0_16_);
                        auVar247 = ZEXT1664(auVar247._0_16_);
                        (*p_Var3)(&local_790);
                        auVar231 = ZEXT3264(_local_760);
                        auVar266 = ZEXT3264(local_880);
                        auVar265 = ZEXT3264(local_860);
                        auVar264 = ZEXT3264(local_840);
                        auVar263 = ZEXT3264(local_960);
                        auVar262 = ZEXT3264(local_940);
                        auVar261 = ZEXT3264(local_820);
                        auVar260 = ZEXT3264(local_920);
                        auVar259 = ZEXT3264(local_800);
                        auVar258 = ZEXT3264(local_900);
                        auVar257 = ZEXT3264(local_8e0);
                        fVar129 = (float)local_980._0_4_;
                        fVar190 = (float)local_980._4_4_;
                        fVar205 = fStack_978;
                        fVar206 = fStack_974;
                        fVar207 = fStack_970;
                        fVar208 = fStack_96c;
                        fVar209 = fStack_968;
                        fVar210 = fStack_964;
                      }
                      auVar236 = ZEXT464((uint)fVar217);
                      uVar59 = vptestmd_avx512vl(local_9a0,local_9a0);
                      uVar59 = uVar59 & 0xf;
                      auVar67 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar4 = (bool)((byte)uVar59 & 1);
                      auVar74._0_4_ =
                           (uint)bVar4 * auVar67._0_4_ |
                           (uint)!bVar4 * *(int *)(local_790.ray + 0x80);
                      bVar4 = (bool)((byte)(uVar59 >> 1) & 1);
                      auVar74._4_4_ =
                           (uint)bVar4 * auVar67._4_4_ |
                           (uint)!bVar4 * *(int *)(local_790.ray + 0x84);
                      bVar4 = (bool)((byte)(uVar59 >> 2) & 1);
                      auVar74._8_4_ =
                           (uint)bVar4 * auVar67._8_4_ |
                           (uint)!bVar4 * *(int *)(local_790.ray + 0x88);
                      bVar4 = SUB81(uVar59 >> 3,0);
                      auVar74._12_4_ =
                           (uint)bVar4 * auVar67._12_4_ |
                           (uint)!bVar4 * *(int *)(local_790.ray + 0x8c);
                      *(undefined1 (*) [16])(local_790.ray + 0x80) = auVar74;
                      bVar51 = 1;
                      if ((byte)uVar59 != 0) goto LAB_01ac0d03;
                    }
                    *(float *)(ray + k * 4 + 0x80) = fVar217;
                  }
                  auVar236 = ZEXT464((uint)fVar217);
                  bVar51 = 0;
                  goto LAB_01ac0d03;
                }
              }
              bVar58 = uVar59 < 4;
              uVar59 = uVar59 + 1;
            } while (uVar59 != 5);
            bVar58 = false;
            bVar51 = 5;
LAB_01ac0cfa:
            auVar231 = ZEXT3264(_local_760);
LAB_01ac0d03:
            bVar56 = (bool)(bVar56 | bVar58 & bVar51);
            uVar148 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar145._4_4_ = uVar148;
            auVar145._0_4_ = uVar148;
            auVar145._8_4_ = uVar148;
            auVar145._12_4_ = uVar148;
            auVar145._16_4_ = uVar148;
            auVar145._20_4_ = uVar148;
            auVar145._24_4_ = uVar148;
            auVar145._28_4_ = uVar148;
            auVar47._4_4_ = fStack_3fc;
            auVar47._0_4_ = local_400;
            auVar47._8_4_ = fStack_3f8;
            auVar47._12_4_ = fStack_3f4;
            auVar47._16_4_ = fStack_3f0;
            auVar47._20_4_ = fStack_3ec;
            auVar47._24_4_ = fStack_3e8;
            auVar47._28_4_ = fStack_3e4;
            uVar12 = vcmpps_avx512vl(auVar145,auVar47,0xd);
            bVar52 = ~('\x01' << ((byte)iVar15 & 0x1f)) & bVar52 & (byte)uVar12;
            auVar117 = local_420;
          } while (bVar52 != 0);
        }
        uVar13 = vpcmpgtd_avx512vl(auVar117,local_3c0);
        uVar14 = vpcmpd_avx512vl(local_3c0,local_340,1);
        auVar188._0_4_ = fVar129 + (float)local_1c0._0_4_;
        auVar188._4_4_ = fVar190 + (float)local_1c0._4_4_;
        auVar188._8_4_ = fVar205 + fStack_1b8;
        auVar188._12_4_ = fVar206 + fStack_1b4;
        auVar188._16_4_ = fVar207 + fStack_1b0;
        auVar188._20_4_ = fVar208 + fStack_1ac;
        auVar188._24_4_ = fVar209 + fStack_1a8;
        auVar188._28_4_ = fVar210 + fStack_1a4;
        uVar12 = vcmpps_avx512vl(auVar188,auVar145,2);
        bVar52 = (byte)local_98c & (byte)uVar14 & (byte)uVar12;
        auVar189._0_4_ = fVar129 + local_3a0._0_4_;
        auVar189._4_4_ = fVar190 + local_3a0._4_4_;
        auVar189._8_4_ = fVar205 + local_3a0._8_4_;
        auVar189._12_4_ = fVar206 + local_3a0._12_4_;
        auVar189._16_4_ = fVar207 + local_3a0._16_4_;
        auVar189._20_4_ = fVar208 + local_3a0._20_4_;
        auVar189._24_4_ = fVar209 + local_3a0._24_4_;
        auVar189._28_4_ = fVar210 + local_3a0._28_4_;
        uVar12 = vcmpps_avx512vl(auVar189,auVar145,2);
        bVar49 = bVar49 & (byte)uVar13 & (byte)uVar12 | bVar52;
        prim = local_5f0;
        if (bVar49 != 0) {
          uVar60 = (ulong)uVar54;
          abStack_180[uVar60 * 0x60] = bVar49;
          auVar121._0_4_ =
               (uint)(bVar52 & 1) * local_1c0._0_4_ |
               (uint)!(bool)(bVar52 & 1) * (int)local_3a0._0_4_;
          bVar58 = (bool)(bVar52 >> 1 & 1);
          auVar121._4_4_ = (uint)bVar58 * local_1c0._4_4_ | (uint)!bVar58 * (int)local_3a0._4_4_;
          bVar58 = (bool)(bVar52 >> 2 & 1);
          auVar121._8_4_ = (uint)bVar58 * (int)fStack_1b8 | (uint)!bVar58 * (int)local_3a0._8_4_;
          bVar58 = (bool)(bVar52 >> 3 & 1);
          auVar121._12_4_ = (uint)bVar58 * (int)fStack_1b4 | (uint)!bVar58 * (int)local_3a0._12_4_;
          bVar58 = (bool)(bVar52 >> 4 & 1);
          auVar121._16_4_ = (uint)bVar58 * (int)fStack_1b0 | (uint)!bVar58 * (int)local_3a0._16_4_;
          bVar58 = (bool)(bVar52 >> 5 & 1);
          auVar121._20_4_ = (uint)bVar58 * (int)fStack_1ac | (uint)!bVar58 * (int)local_3a0._20_4_;
          bVar58 = (bool)(bVar52 >> 6 & 1);
          auVar121._24_4_ = (uint)bVar58 * (int)fStack_1a8 | (uint)!bVar58 * (int)local_3a0._24_4_;
          auVar121._28_4_ =
               (uint)(bVar52 >> 7) * (int)fStack_1a4 |
               (uint)!(bool)(bVar52 >> 7) * (int)local_3a0._28_4_;
          *(undefined1 (*) [32])(auStack_160 + uVar60 * 0x60) = auVar121;
          uVar59 = vmovlps_avx(local_3d0);
          (&uStack_140)[uVar60 * 0xc] = uVar59;
          aiStack_138[uVar60 * 0x18] = local_a1c + 1;
          uVar54 = uVar54 + 1;
        }
      }
    }
    do {
      uVar62 = uVar54;
      uVar61 = uVar62 - 1;
      if (uVar62 == 0) {
        if (bVar56 != false) {
          return bVar56;
        }
        uVar148 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar25._4_4_ = uVar148;
        auVar25._0_4_ = uVar148;
        auVar25._8_4_ = uVar148;
        auVar25._12_4_ = uVar148;
        uVar12 = vcmpps_avx512vl(local_3e0,auVar25,2);
        uVar57 = (uint)local_5e8 & (uint)uVar12;
        local_5e8 = (ulong)uVar57;
        if (uVar57 == 0) {
          return false;
        }
        goto LAB_01abe839;
      }
      uVar59 = (ulong)uVar61;
      lVar53 = uVar59 * 0x60;
      auVar75 = *(undefined1 (*) [32])(auStack_160 + lVar53);
      auVar162._0_4_ = fVar129 + auVar75._0_4_;
      auVar162._4_4_ = fVar190 + auVar75._4_4_;
      auVar162._8_4_ = fVar205 + auVar75._8_4_;
      auVar162._12_4_ = fVar206 + auVar75._12_4_;
      auVar162._16_4_ = fVar207 + auVar75._16_4_;
      auVar162._20_4_ = fVar208 + auVar75._20_4_;
      auVar162._24_4_ = fVar209 + auVar75._24_4_;
      auVar162._28_4_ = fVar210 + auVar75._28_4_;
      uVar148 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar30._4_4_ = uVar148;
      auVar30._0_4_ = uVar148;
      auVar30._8_4_ = uVar148;
      auVar30._12_4_ = uVar148;
      auVar30._16_4_ = uVar148;
      auVar30._20_4_ = uVar148;
      auVar30._24_4_ = uVar148;
      auVar30._28_4_ = uVar148;
      uVar12 = vcmpps_avx512vl(auVar162,auVar30,2);
      uVar122 = (uint)uVar12 & (uint)abStack_180[lVar53];
      uVar54 = uVar61;
    } while (uVar122 == 0);
    uVar60 = (&uStack_140)[uVar59 * 0xc];
    auVar151._8_8_ = 0;
    auVar151._0_8_ = uVar60;
    auVar187._8_4_ = 0x7f800000;
    auVar187._0_8_ = 0x7f8000007f800000;
    auVar187._12_4_ = 0x7f800000;
    auVar187._16_4_ = 0x7f800000;
    auVar187._20_4_ = 0x7f800000;
    auVar187._24_4_ = 0x7f800000;
    auVar187._28_4_ = 0x7f800000;
    auVar76 = vblendmps_avx512vl(auVar187,auVar75);
    bVar49 = (byte)uVar122;
    auVar113._0_4_ =
         (uint)(bVar49 & 1) * auVar76._0_4_ | (uint)!(bool)(bVar49 & 1) * (int)auVar75._0_4_;
    bVar58 = (bool)((byte)(uVar122 >> 1) & 1);
    auVar113._4_4_ = (uint)bVar58 * auVar76._4_4_ | (uint)!bVar58 * (int)auVar75._4_4_;
    bVar58 = (bool)((byte)(uVar122 >> 2) & 1);
    auVar113._8_4_ = (uint)bVar58 * auVar76._8_4_ | (uint)!bVar58 * (int)auVar75._8_4_;
    bVar58 = (bool)((byte)(uVar122 >> 3) & 1);
    auVar113._12_4_ = (uint)bVar58 * auVar76._12_4_ | (uint)!bVar58 * (int)auVar75._12_4_;
    bVar58 = (bool)((byte)(uVar122 >> 4) & 1);
    auVar113._16_4_ = (uint)bVar58 * auVar76._16_4_ | (uint)!bVar58 * (int)auVar75._16_4_;
    bVar58 = (bool)((byte)(uVar122 >> 5) & 1);
    auVar113._20_4_ = (uint)bVar58 * auVar76._20_4_ | (uint)!bVar58 * (int)auVar75._20_4_;
    bVar58 = (bool)((byte)(uVar122 >> 6) & 1);
    auVar113._24_4_ = (uint)bVar58 * auVar76._24_4_ | (uint)!bVar58 * (int)auVar75._24_4_;
    auVar113._28_4_ =
         (uVar122 >> 7) * auVar76._28_4_ | (uint)!SUB41(uVar122 >> 7,0) * (int)auVar75._28_4_;
    auVar75 = vshufps_avx(auVar113,auVar113,0xb1);
    auVar75 = vminps_avx(auVar113,auVar75);
    auVar76 = vshufpd_avx(auVar75,auVar75,5);
    auVar75 = vminps_avx(auVar75,auVar76);
    auVar76 = vpermpd_avx2(auVar75,0x4e);
    auVar75 = vminps_avx(auVar75,auVar76);
    uVar12 = vcmpps_avx512vl(auVar113,auVar75,0);
    bVar52 = (byte)uVar12 & bVar49;
    if (bVar52 != 0) {
      uVar122 = (uint)bVar52;
    }
    uVar123 = 0;
    for (; (uVar122 & 1) == 0; uVar122 = uVar122 >> 1 | 0x80000000) {
      uVar123 = uVar123 + 1;
    }
    local_a1c = aiStack_138[uVar59 * 0x18];
    bVar49 = ~('\x01' << ((byte)uVar123 & 0x1f)) & bVar49;
    abStack_180[lVar53] = bVar49;
    uVar54 = uVar62;
    if (bVar49 == 0) {
      uVar54 = uVar61;
    }
    uVar148 = (undefined4)uVar60;
    auVar142._4_4_ = uVar148;
    auVar142._0_4_ = uVar148;
    auVar142._8_4_ = uVar148;
    auVar142._12_4_ = uVar148;
    auVar142._16_4_ = uVar148;
    auVar142._20_4_ = uVar148;
    auVar142._24_4_ = uVar148;
    auVar142._28_4_ = uVar148;
    auVar67 = vmovshdup_avx(auVar151);
    auVar67 = vsubps_avx(auVar67,auVar151);
    auVar163._0_4_ = auVar67._0_4_;
    auVar163._4_4_ = auVar163._0_4_;
    auVar163._8_4_ = auVar163._0_4_;
    auVar163._12_4_ = auVar163._0_4_;
    auVar163._16_4_ = auVar163._0_4_;
    auVar163._20_4_ = auVar163._0_4_;
    auVar163._24_4_ = auVar163._0_4_;
    auVar163._28_4_ = auVar163._0_4_;
    auVar67 = vfmadd132ps_fma(auVar163,auVar142,_DAT_01faff20);
    _local_520 = ZEXT1632(auVar67);
    local_3d0._8_8_ = 0;
    local_3d0._0_8_ = *(ulong *)(local_520 + (ulong)uVar123 * 4);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }